

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void iadst8x8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined8 uVar106;
  undefined8 uVar107;
  undefined8 uVar108;
  undefined8 uVar109;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  __m128i *in_R8;
  uint in_R9D;
  undefined4 in_register_0000008c;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in0_07;
  __m128i in0_08;
  __m128i in0_09;
  __m128i in0_10;
  __m128i in0_11;
  __m128i in0_12;
  __m128i in0_13;
  __m128i in0_14;
  __m128i in0_15;
  __m128i in0_16;
  __m128i in0_17;
  __m128i in0_18;
  __m128i in0_19;
  __m128i in0_20;
  __m128i in0_21;
  __m128i in0_22;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in1_07;
  __m128i in1_08;
  __m128i in1_09;
  __m128i in1_10;
  __m128i in1_11;
  __m128i in1_12;
  __m128i in1_13;
  __m128i in1_14;
  __m128i in1_15;
  __m128i in1_16;
  __m128i in1_17;
  __m128i in1_18;
  __m128i in1_19;
  __m128i in1_20;
  __m128i in1_21;
  __m128i in1_22;
  __m128i clamp_hi_out_1;
  __m128i clamp_lo_out_1;
  int log_range_out_1;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  __m128i x;
  __m128i v [8];
  __m128i u [8];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i kZero;
  __m128i rnding;
  __m128i cospi32;
  __m128i cospim48;
  __m128i cospi48;
  __m128i cospi16;
  __m128i cospi12;
  __m128i cospi52;
  __m128i cospi28;
  __m128i cospi36;
  __m128i cospi44;
  __m128i cospi20;
  __m128i cospi60;
  __m128i cospi4;
  int32_t *cospi;
  undefined4 in_stack_ffffffffffffe688;
  undefined4 in_stack_ffffffffffffe68c;
  int in_stack_ffffffffffffe690;
  int iVar120;
  int in_stack_ffffffffffffe698;
  undefined8 uVar121;
  undefined8 local_1958;
  undefined8 uStack_1950;
  int local_193c;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  int local_190c;
  undefined1 local_1908 [16];
  undefined1 local_18f8 [16];
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined1 local_1878 [16];
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  int local_17cc;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  int local_17b8;
  int iStack_17b4;
  int iStack_17b0;
  int iStack_17ac;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  int32_t *local_16e8;
  uint local_16e0;
  int local_16dc;
  int local_16d8;
  uint local_16d4;
  undefined8 *local_16d0;
  undefined1 (*local_16c8) [16];
  uint local_16bc;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  uint local_169c;
  undefined8 local_1698;
  undefined8 uStack_1690;
  uint local_167c;
  undefined8 local_1678;
  undefined8 uStack_1670;
  uint local_165c;
  undefined8 local_1658;
  undefined8 uStack_1650;
  uint local_163c;
  undefined8 local_1638;
  undefined8 uStack_1630;
  uint local_161c;
  undefined8 local_1618;
  undefined8 uStack_1610;
  uint local_15fc;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  uint local_15dc;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  uint local_15bc;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  uint local_159c;
  undefined8 local_1598;
  undefined8 uStack_1590;
  uint local_157c;
  undefined8 local_1578;
  undefined8 uStack_1570;
  uint local_155c;
  undefined8 local_1558;
  undefined8 uStack_1550;
  uint local_153c;
  undefined8 local_1538;
  undefined8 uStack_1530;
  uint local_151c;
  undefined8 local_1518;
  undefined8 uStack_1510;
  uint local_14fc;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  uint local_14dc;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  uint local_14bc;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  uint local_149c;
  undefined8 local_1498;
  undefined8 uStack_1490;
  uint local_147c;
  undefined8 local_1478;
  undefined8 uStack_1470;
  uint local_145c;
  undefined8 local_1458;
  undefined8 uStack_1450;
  uint local_143c;
  undefined8 local_1438;
  undefined8 uStack_1430;
  uint local_141c;
  undefined8 local_1418;
  undefined8 uStack_1410;
  uint local_13fc;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  uint local_13dc;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  uint local_13bc;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  uint local_139c;
  undefined8 local_1398;
  undefined8 uStack_1390;
  uint local_137c;
  undefined8 local_1378;
  undefined8 uStack_1370;
  uint local_135c;
  undefined8 local_1358;
  undefined8 uStack_1350;
  uint local_133c;
  undefined8 local_1338;
  undefined8 uStack_1330;
  uint local_131c;
  undefined8 local_1318;
  undefined8 uStack_1310;
  uint local_12fc;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  uint local_12dc;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  int local_12c8;
  int iStack_12c4;
  int iStack_12c0;
  int iStack_12bc;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  int local_12a8;
  int iStack_12a4;
  int iStack_12a0;
  int iStack_129c;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  int local_1268;
  int iStack_1264;
  int iStack_1260;
  int iStack_125c;
  undefined8 local_1258;
  undefined8 uStack_1250;
  int local_1248;
  int iStack_1244;
  int iStack_1240;
  int iStack_123c;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  int local_1208;
  int iStack_1204;
  int iStack_1200;
  int iStack_11fc;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  int local_11e8;
  int iStack_11e4;
  int iStack_11e0;
  int iStack_11dc;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  int local_11a8;
  int iStack_11a4;
  int iStack_11a0;
  int iStack_119c;
  undefined8 local_1198;
  undefined8 uStack_1190;
  int local_1188;
  int iStack_1184;
  int iStack_1180;
  int iStack_117c;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  int local_1148;
  int iStack_1144;
  int iStack_1140;
  int iStack_113c;
  undefined8 local_1138;
  undefined8 uStack_1130;
  int local_1128;
  int iStack_1124;
  int iStack_1120;
  int iStack_111c;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  int local_10e8;
  int iStack_10e4;
  int iStack_10e0;
  int iStack_10dc;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  int local_10c8;
  int iStack_10c4;
  int iStack_10c0;
  int iStack_10bc;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  int local_1088;
  int iStack_1084;
  int iStack_1080;
  int iStack_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  int local_1068;
  int iStack_1064;
  int iStack_1060;
  int iStack_105c;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  int local_1028;
  int iStack_1024;
  int iStack_1020;
  int iStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  int local_1008;
  int iStack_1004;
  int iStack_1000;
  int iStack_ffc;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  int local_fc8;
  int iStack_fc4;
  int iStack_fc0;
  int iStack_fbc;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  int local_fa8;
  int iStack_fa4;
  int iStack_fa0;
  int iStack_f9c;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  int local_f68;
  int iStack_f64;
  int iStack_f60;
  int iStack_f5c;
  undefined8 local_f58;
  undefined8 uStack_f50;
  int local_f48;
  int iStack_f44;
  int iStack_f40;
  int iStack_f3c;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  int local_f08;
  int iStack_f04;
  int iStack_f00;
  int iStack_efc;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  int local_ee8;
  int iStack_ee4;
  int iStack_ee0;
  int iStack_edc;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  int local_ea8;
  int iStack_ea4;
  int iStack_ea0;
  int iStack_e9c;
  undefined8 local_e98;
  undefined8 uStack_e90;
  int local_e88;
  int iStack_e84;
  int iStack_e80;
  int iStack_e7c;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  int local_e48;
  int iStack_e44;
  int iStack_e40;
  int iStack_e3c;
  undefined8 local_e38;
  undefined8 uStack_e30;
  int local_e28;
  int iStack_e24;
  int iStack_e20;
  int iStack_e1c;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  int local_de8;
  int iStack_de4;
  int iStack_de0;
  int iStack_ddc;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  int local_dc8;
  int iStack_dc4;
  int iStack_dc0;
  int iStack_dbc;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  int local_d88;
  int iStack_d84;
  int iStack_d80;
  int iStack_d7c;
  undefined8 local_d78;
  undefined8 uStack_d70;
  int local_d68;
  int iStack_d64;
  int iStack_d60;
  int iStack_d5c;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  int local_d28;
  int iStack_d24;
  int iStack_d20;
  int iStack_d1c;
  undefined8 local_d18;
  undefined8 uStack_d10;
  int local_d08;
  int iStack_d04;
  int iStack_d00;
  int iStack_cfc;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  int local_cc8;
  int iStack_cc4;
  int iStack_cc0;
  int iStack_cbc;
  int local_c68;
  int iStack_c64;
  int iStack_c60;
  int iStack_c5c;
  int local_c58;
  int iStack_c54;
  int iStack_c50;
  int iStack_c4c;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c;
  int32_t local_998;
  int local_994;
  int32_t local_990;
  int32_t local_98c;
  int32_t local_988;
  int32_t local_984;
  int32_t local_980;
  int32_t local_97c;
  int32_t local_978;
  int32_t local_974;
  int32_t local_970;
  int32_t local_96c;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  int32_t local_258;
  int32_t local_254;
  int32_t local_250;
  int32_t local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  int32_t local_238;
  int32_t local_234;
  int32_t local_230;
  int32_t local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  int32_t local_218;
  int32_t local_214;
  int32_t local_210;
  int32_t local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  int32_t local_1f8;
  int32_t local_1f4;
  int32_t local_1f0;
  int32_t local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  int32_t local_1d8;
  int32_t local_1d4;
  int32_t local_1d0;
  int32_t local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  int32_t local_1b8;
  int32_t local_1b4;
  int32_t local_1b0;
  int32_t local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  int32_t local_198;
  int32_t local_194;
  int32_t local_190;
  int32_t local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  int32_t local_178;
  int32_t local_174;
  int32_t local_170;
  int32_t local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  int32_t local_158;
  int32_t local_154;
  int32_t local_150;
  int32_t local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  int32_t local_138;
  int32_t local_134;
  int32_t local_130;
  int32_t local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  int32_t local_f8;
  int32_t local_f4;
  int32_t local_f0;
  int32_t local_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_16dc = (int)in_R8;
  local_16e0 = in_R9D;
  local_16d8 = in_ECX;
  local_16d4 = in_EDX;
  local_16d0 = in_RSI;
  local_16c8 = in_RDI;
  local_16e8 = cospi_arr(in_EDX);
  local_96c = local_16e8[4];
  local_16f8 = CONCAT44(local_96c,local_96c);
  uStack_16f0 = CONCAT44(local_96c,local_96c);
  local_970 = local_16e8[0x3c];
  local_1708 = CONCAT44(local_970,local_970);
  uStack_1700 = CONCAT44(local_970,local_970);
  local_974 = local_16e8[0x14];
  local_1718 = CONCAT44(local_974,local_974);
  uStack_1710 = CONCAT44(local_974,local_974);
  local_978 = local_16e8[0x2c];
  local_1728 = CONCAT44(local_978,local_978);
  uStack_1720 = CONCAT44(local_978,local_978);
  local_97c = local_16e8[0x24];
  local_1738 = CONCAT44(local_97c,local_97c);
  uStack_1730 = CONCAT44(local_97c,local_97c);
  local_980 = local_16e8[0x1c];
  local_1748 = CONCAT44(local_980,local_980);
  uStack_1740 = CONCAT44(local_980,local_980);
  local_984 = local_16e8[0x34];
  local_1758 = CONCAT44(local_984,local_984);
  uStack_1750 = CONCAT44(local_984,local_984);
  local_988 = local_16e8[0xc];
  local_1768 = CONCAT44(local_988,local_988);
  uStack_1760 = CONCAT44(local_988,local_988);
  local_98c = local_16e8[0x10];
  local_1778 = CONCAT44(local_98c,local_98c);
  uStack_1770 = CONCAT44(local_98c,local_98c);
  local_990 = local_16e8[0x30];
  local_1788 = CONCAT44(local_990,local_990);
  uStack_1780 = CONCAT44(local_990,local_990);
  local_994 = -local_16e8[0x30];
  local_1798 = CONCAT44(local_994,local_994);
  uStack_1790 = CONCAT44(local_994,local_994);
  local_998 = local_16e8[0x20];
  local_17a8 = CONCAT44(local_998,local_998);
  uStack_17a0 = CONCAT44(local_998,local_998);
  local_99c = 1 << ((char)local_16d4 - 1U & 0x1f);
  local_9c8 = 0;
  uStack_9c0 = 0;
  local_17c8 = 0;
  uStack_17c0 = 0;
  iVar120 = 8;
  if (local_16d8 != 0) {
    iVar120 = 6;
  }
  if (local_16dc + iVar120 < 0x10) {
    iVar120 = 0x10;
  }
  else {
    iVar120 = 8;
    if (local_16d8 != 0) {
      iVar120 = 6;
    }
    iVar120 = local_16dc + iVar120;
  }
  local_17cc._0_1_ = (char)iVar120;
  local_9a0 = -(1 << ((char)local_17cc - 1U & 0x1f));
  local_17e8 = CONCAT44(local_9a0,local_9a0);
  uStack_17e0 = CONCAT44(local_9a0,local_9a0);
  local_9a4 = (1 << ((char)local_17cc - 1U & 0x1f)) + -1;
  local_17f8 = CONCAT44(local_9a4,local_9a4);
  uStack_17f0 = CONCAT44(local_9a4,local_9a4);
  local_278 = *(undefined8 *)local_16c8[0xe];
  uStack_270 = *(undefined8 *)(local_16c8[0xe] + 8);
  auVar78._8_8_ = uStack_16f0;
  auVar78._0_8_ = local_16f8;
  auVar110 = pmulld(local_16c8[0xe],auVar78);
  local_298 = *(undefined8 *)*local_16c8;
  uStack_290 = *(undefined8 *)(*local_16c8 + 8);
  auVar77._8_8_ = uStack_1700;
  auVar77._0_8_ = local_1708;
  auVar111 = pmulld(*local_16c8,auVar77);
  local_1878._0_8_ = auVar110._0_8_;
  local_1878._8_8_ = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_cd8 = local_1878._0_8_;
  uVar92 = local_cd8;
  uStack_cd0 = local_1878._8_8_;
  uVar93 = uStack_cd0;
  local_ce8 = local_1908._0_8_;
  uVar90 = local_ce8;
  uStack_ce0 = local_1908._8_8_;
  uVar91 = uStack_ce0;
  local_cd8._0_4_ = auVar110._0_4_;
  local_cd8._4_4_ = auVar110._4_4_;
  uStack_cd0._0_4_ = auVar110._8_4_;
  uStack_cd0._4_4_ = auVar110._12_4_;
  local_ce8._0_4_ = auVar111._0_4_;
  local_ce8._4_4_ = auVar111._4_4_;
  uStack_ce0._0_4_ = auVar111._8_4_;
  uStack_ce0._4_4_ = auVar111._12_4_;
  local_1878._4_4_ = local_cd8._4_4_ + local_ce8._4_4_;
  local_1878._0_4_ = (int)local_cd8 + (int)local_ce8;
  local_1878._8_4_ = (int)uStack_cd0 + (int)uStack_ce0;
  local_1878._12_4_ = uStack_cd0._4_4_ + uStack_ce0._4_4_;
  local_cf8 = local_1878._0_8_;
  uStack_cf0 = local_1878._8_8_;
  local_1878._0_4_ = (int)local_cd8 + (int)local_ce8 + local_99c;
  local_1878._4_4_ = local_cd8._4_4_ + local_ce8._4_4_ + local_99c;
  iVar112 = (int)uStack_cd0 + (int)uStack_ce0 + local_99c;
  iVar116 = uStack_cd0._4_4_ + uStack_ce0._4_4_ + local_99c;
  local_1878._8_4_ = iVar112;
  local_1878._12_4_ = iVar116;
  local_12d8 = local_1878._0_8_;
  uStack_12d0 = local_1878._8_8_;
  local_12dc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1878._4_4_ = (int)local_1878._4_4_ >> auVar110;
  local_1878._0_4_ = (int)local_1878._0_4_ >> auVar110;
  local_1878._8_4_ = iVar112 >> auVar110;
  local_1878._12_4_ = iVar116 >> auVar110;
  local_2b8 = *(undefined8 *)local_16c8[0xe];
  uStack_2b0 = *(undefined8 *)(local_16c8[0xe] + 8);
  auVar76._8_8_ = uStack_1700;
  auVar76._0_8_ = local_1708;
  auVar110 = pmulld(local_16c8[0xe],auVar76);
  local_2d8 = *(undefined8 *)*local_16c8;
  uStack_2d0 = *(undefined8 *)(*local_16c8 + 8);
  auVar75._8_8_ = uStack_16f0;
  auVar75._0_8_ = local_16f8;
  auVar111 = pmulld(*local_16c8,auVar75);
  local_1868 = auVar110._0_8_;
  uStack_1860 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_9d8 = local_1868;
  uVar108 = local_9d8;
  uStack_9d0 = uStack_1860;
  uVar109 = uStack_9d0;
  local_9e8 = local_1908._0_8_;
  uVar106 = local_9e8;
  uStack_9e0 = local_1908._8_8_;
  uVar107 = uStack_9e0;
  local_9d8._0_4_ = auVar110._0_4_;
  local_9d8._4_4_ = auVar110._4_4_;
  uStack_9d0._0_4_ = auVar110._8_4_;
  uStack_9d0._4_4_ = auVar110._12_4_;
  local_9e8._0_4_ = auVar111._0_4_;
  local_9e8._4_4_ = auVar111._4_4_;
  uStack_9e0._0_4_ = auVar111._8_4_;
  uStack_9e0._4_4_ = auVar111._12_4_;
  local_1868 = CONCAT44(local_9d8._4_4_ - local_9e8._4_4_,(int)local_9d8 - (int)local_9e8);
  uStack_1860._0_4_ = (int)uStack_9d0 - (int)uStack_9e0;
  uStack_1860._4_4_ = uStack_9d0._4_4_ - uStack_9e0._4_4_;
  local_d18 = local_1868;
  uStack_d10 = uStack_1860;
  iVar112 = ((int)local_9d8 - (int)local_9e8) + local_99c;
  iVar116 = (local_9d8._4_4_ - local_9e8._4_4_) + local_99c;
  iVar113 = ((int)uStack_9d0 - (int)uStack_9e0) + local_99c;
  iVar117 = (uStack_9d0._4_4_ - uStack_9e0._4_4_) + local_99c;
  local_1868 = CONCAT44(iVar116,iVar112);
  uStack_1860._0_4_ = iVar113;
  uStack_1860._4_4_ = iVar117;
  local_12f8 = local_1868;
  uStack_12f0 = uStack_1860;
  local_12fc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1868._4_4_ = iVar116 >> auVar110;
  local_1868._0_4_ = iVar112 >> auVar110;
  uStack_1860._0_4_ = iVar113 >> auVar110;
  uStack_1860._4_4_ = iVar117 >> auVar110;
  local_2f8 = *(undefined8 *)local_16c8[10];
  uStack_2f0 = *(undefined8 *)(local_16c8[10] + 8);
  auVar74._8_8_ = uStack_1710;
  auVar74._0_8_ = local_1718;
  auVar110 = pmulld(local_16c8[10],auVar74);
  local_318 = *(undefined8 *)local_16c8[4];
  uStack_310 = *(undefined8 *)(local_16c8[4] + 8);
  auVar73._8_8_ = uStack_1720;
  auVar73._0_8_ = local_1728;
  auVar111 = pmulld(local_16c8[4],auVar73);
  local_1858 = auVar110._0_8_;
  uStack_1850 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_d38 = local_1858;
  uVar88 = local_d38;
  uStack_d30 = uStack_1850;
  uVar89 = uStack_d30;
  local_d48 = local_1908._0_8_;
  uVar86 = local_d48;
  uStack_d40 = local_1908._8_8_;
  uVar87 = uStack_d40;
  local_d38._0_4_ = auVar110._0_4_;
  local_d38._4_4_ = auVar110._4_4_;
  uStack_d30._0_4_ = auVar110._8_4_;
  uStack_d30._4_4_ = auVar110._12_4_;
  local_d48._0_4_ = auVar111._0_4_;
  local_d48._4_4_ = auVar111._4_4_;
  uStack_d40._0_4_ = auVar111._8_4_;
  uStack_d40._4_4_ = auVar111._12_4_;
  local_1858 = CONCAT44(local_d38._4_4_ + local_d48._4_4_,(int)local_d38 + (int)local_d48);
  uStack_1850._0_4_ = (int)uStack_d30 + (int)uStack_d40;
  uStack_1850._4_4_ = uStack_d30._4_4_ + uStack_d40._4_4_;
  local_d58 = local_1858;
  uStack_d50 = uStack_1850;
  iVar112 = (int)local_d38 + (int)local_d48 + local_99c;
  iVar116 = local_d38._4_4_ + local_d48._4_4_ + local_99c;
  iVar113 = (int)uStack_d30 + (int)uStack_d40 + local_99c;
  iVar117 = uStack_d30._4_4_ + uStack_d40._4_4_ + local_99c;
  local_1858 = CONCAT44(iVar116,iVar112);
  uStack_1850._0_4_ = iVar113;
  uStack_1850._4_4_ = iVar117;
  local_1318 = local_1858;
  uStack_1310 = uStack_1850;
  local_131c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1858._4_4_ = iVar116 >> auVar110;
  local_1858._0_4_ = iVar112 >> auVar110;
  uStack_1850._0_4_ = iVar113 >> auVar110;
  uStack_1850._4_4_ = iVar117 >> auVar110;
  local_338 = *(undefined8 *)local_16c8[10];
  uStack_330 = *(undefined8 *)(local_16c8[10] + 8);
  auVar72._8_8_ = uStack_1720;
  auVar72._0_8_ = local_1728;
  auVar110 = pmulld(local_16c8[10],auVar72);
  local_358 = *(undefined8 *)local_16c8[4];
  uStack_350 = *(undefined8 *)(local_16c8[4] + 8);
  auVar71._8_8_ = uStack_1710;
  auVar71._0_8_ = local_1718;
  auVar111 = pmulld(local_16c8[4],auVar71);
  local_1848 = auVar110._0_8_;
  uStack_1840 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_9f8 = local_1848;
  uVar104 = local_9f8;
  uStack_9f0 = uStack_1840;
  uVar105 = uStack_9f0;
  local_a08 = local_1908._0_8_;
  uVar102 = local_a08;
  uStack_a00 = local_1908._8_8_;
  uVar103 = uStack_a00;
  local_9f8._0_4_ = auVar110._0_4_;
  local_9f8._4_4_ = auVar110._4_4_;
  uStack_9f0._0_4_ = auVar110._8_4_;
  uStack_9f0._4_4_ = auVar110._12_4_;
  local_a08._0_4_ = auVar111._0_4_;
  local_a08._4_4_ = auVar111._4_4_;
  uStack_a00._0_4_ = auVar111._8_4_;
  uStack_a00._4_4_ = auVar111._12_4_;
  local_1848 = CONCAT44(local_9f8._4_4_ - local_a08._4_4_,(int)local_9f8 - (int)local_a08);
  uStack_1840._0_4_ = (int)uStack_9f0 - (int)uStack_a00;
  uStack_1840._4_4_ = uStack_9f0._4_4_ - uStack_a00._4_4_;
  local_d78 = local_1848;
  uStack_d70 = uStack_1840;
  iVar112 = ((int)local_9f8 - (int)local_a08) + local_99c;
  iVar116 = (local_9f8._4_4_ - local_a08._4_4_) + local_99c;
  iVar113 = ((int)uStack_9f0 - (int)uStack_a00) + local_99c;
  iVar117 = (uStack_9f0._4_4_ - uStack_a00._4_4_) + local_99c;
  local_1848 = CONCAT44(iVar116,iVar112);
  uStack_1840._0_4_ = iVar113;
  uStack_1840._4_4_ = iVar117;
  local_1338 = local_1848;
  uStack_1330 = uStack_1840;
  local_133c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1848._4_4_ = iVar116 >> auVar110;
  local_1848._0_4_ = iVar112 >> auVar110;
  uStack_1840._0_4_ = iVar113 >> auVar110;
  uStack_1840._4_4_ = iVar117 >> auVar110;
  local_378 = *(undefined8 *)local_16c8[6];
  uStack_370 = *(undefined8 *)(local_16c8[6] + 8);
  auVar70._8_8_ = uStack_1730;
  auVar70._0_8_ = local_1738;
  auVar110 = pmulld(local_16c8[6],auVar70);
  local_398 = *(undefined8 *)local_16c8[8];
  uStack_390 = *(undefined8 *)(local_16c8[8] + 8);
  auVar69._8_8_ = uStack_1740;
  auVar69._0_8_ = local_1748;
  auVar111 = pmulld(local_16c8[8],auVar69);
  local_1838 = auVar110._0_8_;
  uStack_1830 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_d98 = local_1838;
  uVar84 = local_d98;
  uStack_d90 = uStack_1830;
  uVar85 = uStack_d90;
  local_da8 = local_1908._0_8_;
  uVar82 = local_da8;
  uStack_da0 = local_1908._8_8_;
  uVar83 = uStack_da0;
  local_d98._0_4_ = auVar110._0_4_;
  local_d98._4_4_ = auVar110._4_4_;
  uStack_d90._0_4_ = auVar110._8_4_;
  uStack_d90._4_4_ = auVar110._12_4_;
  local_da8._0_4_ = auVar111._0_4_;
  local_da8._4_4_ = auVar111._4_4_;
  uStack_da0._0_4_ = auVar111._8_4_;
  uStack_da0._4_4_ = auVar111._12_4_;
  local_1838 = CONCAT44(local_d98._4_4_ + local_da8._4_4_,(int)local_d98 + (int)local_da8);
  uStack_1830._0_4_ = (int)uStack_d90 + (int)uStack_da0;
  uStack_1830._4_4_ = uStack_d90._4_4_ + uStack_da0._4_4_;
  local_db8 = local_1838;
  uStack_db0 = uStack_1830;
  iVar112 = (int)local_d98 + (int)local_da8 + local_99c;
  iVar116 = local_d98._4_4_ + local_da8._4_4_ + local_99c;
  iVar113 = (int)uStack_d90 + (int)uStack_da0 + local_99c;
  iVar117 = uStack_d90._4_4_ + uStack_da0._4_4_ + local_99c;
  local_1838 = CONCAT44(iVar116,iVar112);
  uStack_1830._0_4_ = iVar113;
  uStack_1830._4_4_ = iVar117;
  local_1358 = local_1838;
  uStack_1350 = uStack_1830;
  local_135c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1838._4_4_ = iVar116 >> auVar110;
  local_1838._0_4_ = iVar112 >> auVar110;
  uStack_1830._0_4_ = iVar113 >> auVar110;
  uStack_1830._4_4_ = iVar117 >> auVar110;
  local_3b8 = *(undefined8 *)local_16c8[6];
  uStack_3b0 = *(undefined8 *)(local_16c8[6] + 8);
  auVar68._8_8_ = uStack_1740;
  auVar68._0_8_ = local_1748;
  auVar110 = pmulld(local_16c8[6],auVar68);
  local_3d8 = *(undefined8 *)local_16c8[8];
  uStack_3d0 = *(undefined8 *)(local_16c8[8] + 8);
  auVar67._8_8_ = uStack_1730;
  auVar67._0_8_ = local_1738;
  auVar111 = pmulld(local_16c8[8],auVar67);
  local_1828 = auVar110._0_8_;
  uStack_1820 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_a18 = local_1828;
  uVar100 = local_a18;
  uStack_a10 = uStack_1820;
  uVar101 = uStack_a10;
  local_a28 = local_1908._0_8_;
  uVar98 = local_a28;
  uStack_a20 = local_1908._8_8_;
  uVar99 = uStack_a20;
  local_a18._0_4_ = auVar110._0_4_;
  local_a18._4_4_ = auVar110._4_4_;
  uStack_a10._0_4_ = auVar110._8_4_;
  uStack_a10._4_4_ = auVar110._12_4_;
  local_a28._0_4_ = auVar111._0_4_;
  local_a28._4_4_ = auVar111._4_4_;
  uStack_a20._0_4_ = auVar111._8_4_;
  uStack_a20._4_4_ = auVar111._12_4_;
  local_1828 = CONCAT44(local_a18._4_4_ - local_a28._4_4_,(int)local_a18 - (int)local_a28);
  uStack_1820._0_4_ = (int)uStack_a10 - (int)uStack_a20;
  uStack_1820._4_4_ = uStack_a10._4_4_ - uStack_a20._4_4_;
  local_dd8 = local_1828;
  uStack_dd0 = uStack_1820;
  iVar112 = ((int)local_a18 - (int)local_a28) + local_99c;
  iVar116 = (local_a18._4_4_ - local_a28._4_4_) + local_99c;
  iVar113 = ((int)uStack_a10 - (int)uStack_a20) + local_99c;
  iVar117 = (uStack_a10._4_4_ - uStack_a20._4_4_) + local_99c;
  local_1828 = CONCAT44(iVar116,iVar112);
  uStack_1820._0_4_ = iVar113;
  uStack_1820._4_4_ = iVar117;
  local_1378 = local_1828;
  uStack_1370 = uStack_1820;
  local_137c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1828._4_4_ = iVar116 >> auVar110;
  local_1828._0_4_ = iVar112 >> auVar110;
  uStack_1820._0_4_ = iVar113 >> auVar110;
  uStack_1820._4_4_ = iVar117 >> auVar110;
  local_3f8 = *(undefined8 *)local_16c8[2];
  uStack_3f0 = *(undefined8 *)(local_16c8[2] + 8);
  auVar66._8_8_ = uStack_1750;
  auVar66._0_8_ = local_1758;
  auVar110 = pmulld(local_16c8[2],auVar66);
  local_418 = *(undefined8 *)local_16c8[0xc];
  uStack_410 = *(undefined8 *)(local_16c8[0xc] + 8);
  auVar65._8_8_ = uStack_1760;
  auVar65._0_8_ = local_1768;
  auVar111 = pmulld(local_16c8[0xc],auVar65);
  local_1818 = auVar110._0_8_;
  uStack_1810 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_df8 = local_1818;
  uVar80 = local_df8;
  uStack_df0 = uStack_1810;
  uVar81 = uStack_df0;
  local_e08 = local_1908._0_8_;
  uVar121 = local_e08;
  uStack_e00 = local_1908._8_8_;
  uVar79 = uStack_e00;
  local_df8._0_4_ = auVar110._0_4_;
  local_df8._4_4_ = auVar110._4_4_;
  uStack_df0._0_4_ = auVar110._8_4_;
  uStack_df0._4_4_ = auVar110._12_4_;
  local_e08._0_4_ = auVar111._0_4_;
  local_e08._4_4_ = auVar111._4_4_;
  uStack_e00._0_4_ = auVar111._8_4_;
  uStack_e00._4_4_ = auVar111._12_4_;
  local_1818 = CONCAT44(local_df8._4_4_ + local_e08._4_4_,(int)local_df8 + (int)local_e08);
  uStack_1810._0_4_ = (int)uStack_df0 + (int)uStack_e00;
  uStack_1810._4_4_ = uStack_df0._4_4_ + uStack_e00._4_4_;
  local_e18 = local_1818;
  uStack_e10 = uStack_1810;
  iVar112 = (int)local_df8 + (int)local_e08 + local_99c;
  iVar116 = local_df8._4_4_ + local_e08._4_4_ + local_99c;
  iVar113 = (int)uStack_df0 + (int)uStack_e00 + local_99c;
  iVar117 = uStack_df0._4_4_ + uStack_e00._4_4_ + local_99c;
  local_1818 = CONCAT44(iVar116,iVar112);
  uStack_1810._0_4_ = iVar113;
  uStack_1810._4_4_ = iVar117;
  local_1398 = local_1818;
  uStack_1390 = uStack_1810;
  local_139c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1818._4_4_ = iVar116 >> auVar110;
  local_1818._0_4_ = iVar112 >> auVar110;
  uStack_1810._0_4_ = iVar113 >> auVar110;
  uStack_1810._4_4_ = iVar117 >> auVar110;
  local_438 = *(undefined8 *)local_16c8[2];
  uStack_430 = *(undefined8 *)(local_16c8[2] + 8);
  auVar64._8_8_ = uStack_1760;
  auVar64._0_8_ = local_1768;
  auVar110 = pmulld(local_16c8[2],auVar64);
  local_458 = *(undefined8 *)local_16c8[0xc];
  uStack_450 = *(undefined8 *)(local_16c8[0xc] + 8);
  auVar63._8_8_ = uStack_1750;
  auVar63._0_8_ = local_1758;
  local_1908 = pmulld(local_16c8[0xc],auVar63);
  local_1808 = auVar110._0_8_;
  uStack_1800 = auVar110._8_8_;
  local_a38 = local_1808;
  uVar96 = local_a38;
  uStack_a30 = uStack_1800;
  uVar97 = uStack_a30;
  local_a48 = local_1908._0_8_;
  uVar94 = local_a48;
  uStack_a40 = local_1908._8_8_;
  uVar95 = uStack_a40;
  local_a38._0_4_ = auVar110._0_4_;
  local_a38._4_4_ = auVar110._4_4_;
  uStack_a30._0_4_ = auVar110._8_4_;
  uStack_a30._4_4_ = auVar110._12_4_;
  local_a48._0_4_ = local_1908._0_4_;
  local_a48._4_4_ = local_1908._4_4_;
  uStack_a40._0_4_ = local_1908._8_4_;
  uStack_a40._4_4_ = local_1908._12_4_;
  local_1808 = CONCAT44(local_a38._4_4_ - local_a48._4_4_,(int)local_a38 - (int)local_a48);
  uStack_1800._0_4_ = (int)uStack_a30 - (int)uStack_a40;
  uStack_1800._4_4_ = uStack_a30._4_4_ - uStack_a40._4_4_;
  local_e38 = local_1808;
  uStack_e30 = uStack_1800;
  iVar112 = ((int)local_a38 - (int)local_a48) + local_99c;
  iVar116 = (local_a38._4_4_ - local_a48._4_4_) + local_99c;
  iVar113 = ((int)uStack_a30 - (int)uStack_a40) + local_99c;
  iVar117 = (uStack_a30._4_4_ - uStack_a40._4_4_) + local_99c;
  local_1808 = CONCAT44(iVar116,iVar112);
  uStack_1800._0_4_ = iVar113;
  uStack_1800._4_4_ = iVar117;
  local_13b8 = local_1808;
  uStack_13b0 = uStack_1800;
  local_13bc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1808._4_4_ = iVar116 >> auVar110;
  local_1808._0_4_ = iVar112 >> auVar110;
  uStack_1800._0_4_ = iVar113 >> auVar110;
  uStack_1800._4_4_ = iVar117 >> auVar110;
  in0[1] = &local_18b8;
  in0[0] = (longlong)local_18f8;
  in1[1] = (longlong)&local_17f8;
  in1[0] = (longlong)&local_17e8;
  local_17cc = iVar120;
  local_e08 = uVar121;
  uStack_e00 = uVar79;
  local_df8 = uVar80;
  uStack_df0 = uVar81;
  local_da8 = uVar82;
  uStack_da0 = uVar83;
  local_d98 = uVar84;
  uStack_d90 = uVar85;
  local_d48 = uVar86;
  uStack_d40 = uVar87;
  local_d38 = uVar88;
  uStack_d30 = uVar89;
  local_ce8 = uVar90;
  uStack_ce0 = uVar91;
  local_cd8 = uVar92;
  uStack_cd0 = uVar93;
  local_a48 = uVar94;
  uStack_a40 = uVar95;
  local_a38 = uVar96;
  uStack_a30 = uVar97;
  local_a28 = uVar98;
  uStack_a20 = uVar99;
  local_a18 = uVar100;
  uStack_a10 = uVar101;
  local_a08 = uVar102;
  uStack_a00 = uVar103;
  local_9f8 = uVar104;
  uStack_9f0 = uVar105;
  local_9e8 = uVar106;
  uStack_9e0 = uVar107;
  local_9d8 = uVar108;
  uStack_9d0 = uVar109;
  local_468 = local_1758;
  uStack_460 = uStack_1750;
  local_448 = local_1768;
  uStack_440 = uStack_1760;
  local_428 = local_1768;
  uStack_420 = uStack_1760;
  local_408 = local_1758;
  uStack_400 = uStack_1750;
  local_3e8 = local_1738;
  uStack_3e0 = uStack_1730;
  local_3c8 = local_1748;
  uStack_3c0 = uStack_1740;
  local_3a8 = local_1748;
  uStack_3a0 = uStack_1740;
  local_388 = local_1738;
  uStack_380 = uStack_1730;
  local_368 = local_1718;
  uStack_360 = uStack_1710;
  local_348 = local_1728;
  uStack_340 = uStack_1720;
  local_328 = local_1728;
  uStack_320 = uStack_1720;
  local_308 = local_1718;
  uStack_300 = uStack_1710;
  local_2e8 = local_16f8;
  uStack_2e0 = uStack_16f0;
  local_2c8 = local_1708;
  uStack_2c0 = uStack_1700;
  local_2a8 = local_1708;
  uStack_2a0 = uStack_1700;
  local_288 = local_16f8;
  uStack_280 = uStack_16f0;
  local_268 = local_16f8;
  uStack_260 = uStack_16f0;
  local_258 = local_96c;
  local_254 = local_96c;
  local_250 = local_96c;
  local_24c = local_96c;
  local_248 = local_1708;
  uStack_240 = uStack_1700;
  local_238 = local_970;
  local_234 = local_970;
  local_230 = local_970;
  local_22c = local_970;
  local_228 = local_1718;
  uStack_220 = uStack_1710;
  local_218 = local_974;
  local_214 = local_974;
  local_210 = local_974;
  local_20c = local_974;
  local_208 = local_1728;
  uStack_200 = uStack_1720;
  local_1f8 = local_978;
  local_1f4 = local_978;
  local_1f0 = local_978;
  local_1ec = local_978;
  local_1e8 = local_1738;
  uStack_1e0 = uStack_1730;
  local_1d8 = local_97c;
  local_1d4 = local_97c;
  local_1d0 = local_97c;
  local_1cc = local_97c;
  local_1c8 = local_1748;
  uStack_1c0 = uStack_1740;
  local_1b8 = local_980;
  local_1b4 = local_980;
  local_1b0 = local_980;
  local_1ac = local_980;
  local_1a8 = local_1758;
  uStack_1a0 = uStack_1750;
  local_198 = local_984;
  local_194 = local_984;
  local_190 = local_984;
  local_18c = local_984;
  local_188 = local_1768;
  uStack_180 = uStack_1760;
  local_178 = local_988;
  local_174 = local_988;
  local_170 = local_988;
  local_16c = local_988;
  local_168 = local_1778;
  uStack_160 = uStack_1770;
  local_158 = local_98c;
  local_154 = local_98c;
  local_150 = local_98c;
  local_14c = local_98c;
  local_148 = local_1788;
  uStack_140 = uStack_1780;
  local_138 = local_990;
  local_134 = local_990;
  local_130 = local_990;
  local_12c = local_990;
  local_128 = local_1798;
  uStack_120 = uStack_1790;
  local_118 = local_994;
  local_114 = local_994;
  local_110 = local_994;
  local_10c = local_994;
  local_108 = local_17a8;
  uStack_100 = uStack_17a0;
  local_f8 = local_998;
  local_f4 = local_998;
  local_f0 = local_998;
  local_ec = local_998;
  local_d8 = local_99c;
  local_d4 = local_99c;
  local_d0 = local_99c;
  local_cc = local_99c;
  local_c8 = local_17e8;
  uStack_c0 = uStack_17e0;
  local_b8 = local_9a0;
  local_b4 = local_9a0;
  local_b0 = local_9a0;
  local_ac = local_9a0;
  local_a8 = local_17f8;
  uStack_a0 = uStack_17f0;
  local_98 = local_9a4;
  local_94 = local_9a4;
  local_90 = local_9a4;
  local_8c = local_9a4;
  local_17b8 = local_99c;
  iStack_17b4 = local_99c;
  local_e48 = local_99c;
  iStack_e44 = local_99c;
  local_e28 = local_99c;
  iStack_e24 = local_99c;
  local_de8 = local_99c;
  iStack_de4 = local_99c;
  local_dc8 = local_99c;
  iStack_dc4 = local_99c;
  local_d88 = local_99c;
  iStack_d84 = local_99c;
  local_d68 = local_99c;
  iStack_d64 = local_99c;
  local_d28 = local_99c;
  iStack_d24 = local_99c;
  local_d08 = local_99c;
  iStack_d04 = local_99c;
  local_e8 = local_99c;
  iStack_e4 = local_99c;
  iStack_17b0 = local_99c;
  iStack_17ac = local_99c;
  iStack_e40 = local_99c;
  iStack_e3c = local_99c;
  iStack_e20 = local_99c;
  iStack_e1c = local_99c;
  iStack_de0 = local_99c;
  iStack_ddc = local_99c;
  iStack_dc0 = local_99c;
  iStack_dbc = local_99c;
  iStack_d80 = local_99c;
  iStack_d7c = local_99c;
  iStack_d60 = local_99c;
  iStack_d5c = local_99c;
  iStack_d20 = local_99c;
  iStack_d1c = local_99c;
  iStack_d00 = local_99c;
  iStack_cfc = local_99c;
  iStack_e0 = local_99c;
  iStack_dc = local_99c;
  addsub_sse4_1(in0,in1,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_00[0] = &local_18e8;
  in0_00[1] = &local_18a8;
  in1_00[1] = (longlong)&local_17f8;
  in1_00[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_00,in1_00,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_01[0] = &local_18d8;
  in0_01[1] = &local_1898;
  in1_01[1] = (longlong)&local_17f8;
  in1_01[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_01,in1_01,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_02[0] = &local_18c8;
  in0_02[1] = &local_1888;
  in1_02[1] = (longlong)&local_17f8;
  in1_02[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_02,in1_02,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  local_1878._0_8_ = local_18f8._0_8_;
  local_1878._8_8_ = local_18f8._8_8_;
  local_478 = local_18b8;
  uStack_470 = uStack_18b0;
  local_488 = local_1778;
  uStack_480 = uStack_1770;
  auVar62._8_8_ = uStack_18b0;
  auVar62._0_8_ = local_18b8;
  auVar61._8_8_ = uStack_1770;
  auVar61._0_8_ = local_1778;
  auVar110 = pmulld(auVar62,auVar61);
  local_498 = local_18a8;
  uStack_490 = uStack_18a0;
  local_4a8 = local_1788;
  uStack_4a0 = uStack_1780;
  auVar60._8_8_ = uStack_18a0;
  auVar60._0_8_ = local_18a8;
  auVar59._8_8_ = uStack_1780;
  auVar59._0_8_ = local_1788;
  auVar111 = pmulld(auVar60,auVar59);
  local_1838 = auVar110._0_8_;
  uStack_1830 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_e58 = local_1838;
  uVar84 = local_e58;
  uStack_e50 = uStack_1830;
  uVar85 = uStack_e50;
  local_e68 = local_1908._0_8_;
  uVar82 = local_e68;
  uStack_e60 = local_1908._8_8_;
  uVar83 = uStack_e60;
  local_e58._0_4_ = auVar110._0_4_;
  local_e58._4_4_ = auVar110._4_4_;
  uStack_e50._0_4_ = auVar110._8_4_;
  uStack_e50._4_4_ = auVar110._12_4_;
  local_e68._0_4_ = auVar111._0_4_;
  local_e68._4_4_ = auVar111._4_4_;
  uStack_e60._0_4_ = auVar111._8_4_;
  uStack_e60._4_4_ = auVar111._12_4_;
  local_1838 = CONCAT44(local_e58._4_4_ + local_e68._4_4_,(int)local_e58 + (int)local_e68);
  uStack_1830._0_4_ = (int)uStack_e50 + (int)uStack_e60;
  uStack_1830._4_4_ = uStack_e50._4_4_ + uStack_e60._4_4_;
  local_e78 = local_1838;
  uStack_e70 = uStack_1830;
  local_e88 = local_17b8;
  iStack_e84 = iStack_17b4;
  iStack_e80 = iStack_17b0;
  iStack_e7c = iStack_17ac;
  iVar112 = (int)local_e58 + (int)local_e68 + local_17b8;
  iVar116 = local_e58._4_4_ + local_e68._4_4_ + iStack_17b4;
  iVar113 = (int)uStack_e50 + (int)uStack_e60 + iStack_17b0;
  iVar117 = uStack_e50._4_4_ + uStack_e60._4_4_ + iStack_17ac;
  local_1838 = CONCAT44(iVar116,iVar112);
  uStack_1830._0_4_ = iVar113;
  uStack_1830._4_4_ = iVar117;
  local_13d8 = local_1838;
  uStack_13d0 = uStack_1830;
  local_13dc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1838._4_4_ = iVar116 >> auVar110;
  local_1838._0_4_ = iVar112 >> auVar110;
  uStack_1830._0_4_ = iVar113 >> auVar110;
  uStack_1830._4_4_ = iVar117 >> auVar110;
  local_4b8 = local_18b8;
  uStack_4b0 = uStack_18b0;
  local_4c8 = local_1788;
  uStack_4c0 = uStack_1780;
  auVar58._8_8_ = uStack_18b0;
  auVar58._0_8_ = local_18b8;
  auVar57._8_8_ = uStack_1780;
  auVar57._0_8_ = local_1788;
  auVar110 = pmulld(auVar58,auVar57);
  local_4d8 = local_18a8;
  uStack_4d0 = uStack_18a0;
  local_4e8 = local_1778;
  uStack_4e0 = uStack_1770;
  auVar56._8_8_ = uStack_18a0;
  auVar56._0_8_ = local_18a8;
  auVar55._8_8_ = uStack_1770;
  auVar55._0_8_ = local_1778;
  auVar111 = pmulld(auVar56,auVar55);
  local_1828 = auVar110._0_8_;
  uStack_1820 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_a58 = local_1828;
  uVar92 = local_a58;
  uStack_a50 = uStack_1820;
  uVar93 = uStack_a50;
  local_a68 = local_1908._0_8_;
  uVar90 = local_a68;
  uStack_a60 = local_1908._8_8_;
  uVar91 = uStack_a60;
  local_a58._0_4_ = auVar110._0_4_;
  local_a58._4_4_ = auVar110._4_4_;
  uStack_a50._0_4_ = auVar110._8_4_;
  uStack_a50._4_4_ = auVar110._12_4_;
  local_a68._0_4_ = auVar111._0_4_;
  local_a68._4_4_ = auVar111._4_4_;
  uStack_a60._0_4_ = auVar111._8_4_;
  uStack_a60._4_4_ = auVar111._12_4_;
  local_1828 = CONCAT44(local_a58._4_4_ - local_a68._4_4_,(int)local_a58 - (int)local_a68);
  uStack_1820._0_4_ = (int)uStack_a50 - (int)uStack_a60;
  uStack_1820._4_4_ = uStack_a50._4_4_ - uStack_a60._4_4_;
  local_e98 = local_1828;
  uStack_e90 = uStack_1820;
  local_ea8 = local_17b8;
  iStack_ea4 = iStack_17b4;
  iStack_ea0 = iStack_17b0;
  iStack_e9c = iStack_17ac;
  iVar112 = ((int)local_a58 - (int)local_a68) + local_17b8;
  iVar116 = (local_a58._4_4_ - local_a68._4_4_) + iStack_17b4;
  iVar113 = ((int)uStack_a50 - (int)uStack_a60) + iStack_17b0;
  iVar117 = (uStack_a50._4_4_ - uStack_a60._4_4_) + iStack_17ac;
  local_1828 = CONCAT44(iVar116,iVar112);
  uStack_1820._0_4_ = iVar113;
  uStack_1820._4_4_ = iVar117;
  local_13f8 = local_1828;
  uStack_13f0 = uStack_1820;
  local_13fc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1828._4_4_ = iVar116 >> auVar110;
  local_1828._0_4_ = iVar112 >> auVar110;
  uStack_1820._0_4_ = iVar113 >> auVar110;
  uStack_1820._4_4_ = iVar117 >> auVar110;
  local_4f8 = local_1898;
  uStack_4f0 = uStack_1890;
  local_508 = local_1798;
  uStack_500 = uStack_1790;
  auVar54._8_8_ = uStack_1890;
  auVar54._0_8_ = local_1898;
  auVar53._8_8_ = uStack_1790;
  auVar53._0_8_ = local_1798;
  auVar110 = pmulld(auVar54,auVar53);
  local_518 = local_1888;
  uStack_510 = uStack_1880;
  local_528 = local_1778;
  uStack_520 = uStack_1770;
  auVar52._8_8_ = uStack_1880;
  auVar52._0_8_ = local_1888;
  auVar51._8_8_ = uStack_1770;
  auVar51._0_8_ = local_1778;
  auVar111 = pmulld(auVar52,auVar51);
  local_1818 = auVar110._0_8_;
  uStack_1810 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_eb8 = local_1818;
  uVar80 = local_eb8;
  uStack_eb0 = uStack_1810;
  uVar81 = uStack_eb0;
  local_ec8 = local_1908._0_8_;
  uVar121 = local_ec8;
  uStack_ec0 = local_1908._8_8_;
  uVar79 = uStack_ec0;
  local_eb8._0_4_ = auVar110._0_4_;
  local_eb8._4_4_ = auVar110._4_4_;
  uStack_eb0._0_4_ = auVar110._8_4_;
  uStack_eb0._4_4_ = auVar110._12_4_;
  local_ec8._0_4_ = auVar111._0_4_;
  local_ec8._4_4_ = auVar111._4_4_;
  uStack_ec0._0_4_ = auVar111._8_4_;
  uStack_ec0._4_4_ = auVar111._12_4_;
  local_1818 = CONCAT44(local_eb8._4_4_ + local_ec8._4_4_,(int)local_eb8 + (int)local_ec8);
  uStack_1810._0_4_ = (int)uStack_eb0 + (int)uStack_ec0;
  uStack_1810._4_4_ = uStack_eb0._4_4_ + uStack_ec0._4_4_;
  local_ed8 = local_1818;
  uStack_ed0 = uStack_1810;
  local_ee8 = local_17b8;
  iStack_ee4 = iStack_17b4;
  iStack_ee0 = iStack_17b0;
  iStack_edc = iStack_17ac;
  iVar112 = (int)local_eb8 + (int)local_ec8 + local_17b8;
  iVar116 = local_eb8._4_4_ + local_ec8._4_4_ + iStack_17b4;
  iVar113 = (int)uStack_eb0 + (int)uStack_ec0 + iStack_17b0;
  iVar117 = uStack_eb0._4_4_ + uStack_ec0._4_4_ + iStack_17ac;
  local_1818 = CONCAT44(iVar116,iVar112);
  uStack_1810._0_4_ = iVar113;
  uStack_1810._4_4_ = iVar117;
  local_1418 = local_1818;
  uStack_1410 = uStack_1810;
  local_141c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1818._4_4_ = iVar116 >> auVar110;
  local_1818._0_4_ = iVar112 >> auVar110;
  uStack_1810._0_4_ = iVar113 >> auVar110;
  uStack_1810._4_4_ = iVar117 >> auVar110;
  local_538 = local_1898;
  uStack_530 = uStack_1890;
  local_548 = local_1778;
  uStack_540 = uStack_1770;
  auVar50._8_8_ = uStack_1890;
  auVar50._0_8_ = local_1898;
  auVar49._8_8_ = uStack_1770;
  auVar49._0_8_ = local_1778;
  auVar110 = pmulld(auVar50,auVar49);
  local_558 = local_1888;
  uStack_550 = uStack_1880;
  local_568 = local_1798;
  uStack_560 = uStack_1790;
  auVar48._8_8_ = uStack_1880;
  auVar48._0_8_ = local_1888;
  auVar47._8_8_ = uStack_1790;
  auVar47._0_8_ = local_1798;
  local_1908 = pmulld(auVar48,auVar47);
  local_1808 = auVar110._0_8_;
  uStack_1800 = auVar110._8_8_;
  local_a78 = local_1808;
  uVar88 = local_a78;
  uStack_a70 = uStack_1800;
  uVar89 = uStack_a70;
  local_a88 = local_1908._0_8_;
  uVar86 = local_a88;
  uStack_a80 = local_1908._8_8_;
  uVar87 = uStack_a80;
  local_a78._0_4_ = auVar110._0_4_;
  local_a78._4_4_ = auVar110._4_4_;
  uStack_a70._0_4_ = auVar110._8_4_;
  uStack_a70._4_4_ = auVar110._12_4_;
  local_a88._0_4_ = local_1908._0_4_;
  local_a88._4_4_ = local_1908._4_4_;
  uStack_a80._0_4_ = local_1908._8_4_;
  uStack_a80._4_4_ = local_1908._12_4_;
  local_1808 = CONCAT44(local_a78._4_4_ - local_a88._4_4_,(int)local_a78 - (int)local_a88);
  uStack_1800._0_4_ = (int)uStack_a70 - (int)uStack_a80;
  uStack_1800._4_4_ = uStack_a70._4_4_ - uStack_a80._4_4_;
  local_ef8 = local_1808;
  uStack_ef0 = uStack_1800;
  local_f08 = local_17b8;
  iStack_f04 = iStack_17b4;
  iStack_f00 = iStack_17b0;
  iStack_efc = iStack_17ac;
  iVar112 = ((int)local_a78 - (int)local_a88) + local_17b8;
  iVar116 = (local_a78._4_4_ - local_a88._4_4_) + iStack_17b4;
  iVar113 = ((int)uStack_a70 - (int)uStack_a80) + iStack_17b0;
  iVar117 = (uStack_a70._4_4_ - uStack_a80._4_4_) + iStack_17ac;
  local_1808 = CONCAT44(iVar116,iVar112);
  uStack_1800._0_4_ = iVar113;
  uStack_1800._4_4_ = iVar117;
  local_1438 = local_1808;
  uStack_1430 = uStack_1800;
  local_143c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1808._4_4_ = iVar116 >> auVar110;
  local_1808._0_4_ = iVar112 >> auVar110;
  uStack_1800._0_4_ = iVar113 >> auVar110;
  uStack_1800._4_4_ = iVar117 >> auVar110;
  in0_03[1] = &local_18d8;
  in0_03[0] = (longlong)local_18f8;
  in1_03[1] = (longlong)&local_17f8;
  in1_03[0] = (longlong)&local_17e8;
  local_ec8 = uVar121;
  uStack_ec0 = uVar79;
  local_eb8 = uVar80;
  uStack_eb0 = uVar81;
  local_e68 = uVar82;
  uStack_e60 = uVar83;
  local_e58 = uVar84;
  uStack_e50 = uVar85;
  local_a88 = uVar86;
  uStack_a80 = uVar87;
  local_a78 = uVar88;
  uStack_a70 = uVar89;
  local_a68 = uVar90;
  uStack_a60 = uVar91;
  local_a58 = uVar92;
  uStack_a50 = uVar93;
  addsub_sse4_1(in0_03,in1_03,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_04[0] = &local_18e8;
  in0_04[1] = &local_18c8;
  in1_04[1] = (longlong)&local_17f8;
  in1_04[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_04,in1_04,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_05[0] = &local_18b8;
  in0_05[1] = &local_1898;
  in1_05[1] = (longlong)&local_17f8;
  in1_05[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_05,in1_05,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_06[0] = &local_18a8;
  in0_06[1] = &local_1888;
  in1_06[1] = (longlong)&local_17f8;
  in1_06[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_06,in1_06,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  uVar121 = local_18f8._0_8_;
  uVar79 = local_18f8._8_8_;
  local_578 = local_18d8;
  uStack_570 = uStack_18d0;
  local_588 = local_17a8;
  uStack_580 = uStack_17a0;
  auVar46._8_8_ = uStack_18d0;
  auVar46._0_8_ = local_18d8;
  auVar45._8_8_ = uStack_17a0;
  auVar45._0_8_ = local_17a8;
  auVar110 = pmulld(auVar46,auVar45);
  local_598 = local_18c8;
  uStack_590 = uStack_18c0;
  local_5a8 = local_17a8;
  uStack_5a0 = uStack_17a0;
  auVar44._8_8_ = uStack_18c0;
  auVar44._0_8_ = local_18c8;
  auVar43._8_8_ = uStack_17a0;
  auVar43._0_8_ = local_17a8;
  auVar111 = pmulld(auVar44,auVar43);
  local_18f8._0_8_ = auVar110._0_8_;
  local_18f8._8_8_ = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_f18 = local_18f8._0_8_;
  uVar86 = local_f18;
  uStack_f10 = local_18f8._8_8_;
  uVar87 = uStack_f10;
  local_f28 = local_1908._0_8_;
  uVar84 = local_f28;
  uStack_f20 = local_1908._8_8_;
  uVar85 = uStack_f20;
  local_f18._0_4_ = auVar110._0_4_;
  local_f18._4_4_ = auVar110._4_4_;
  uStack_f10._0_4_ = auVar110._8_4_;
  uStack_f10._4_4_ = auVar110._12_4_;
  local_f28._0_4_ = auVar111._0_4_;
  local_f28._4_4_ = auVar111._4_4_;
  uStack_f20._0_4_ = auVar111._8_4_;
  uStack_f20._4_4_ = auVar111._12_4_;
  local_1858 = CONCAT44(local_f18._4_4_ + local_f28._4_4_,(int)local_f18 + (int)local_f28);
  uStack_1850._0_4_ = (int)uStack_f10 + (int)uStack_f20;
  uStack_1850._4_4_ = uStack_f10._4_4_ + uStack_f20._4_4_;
  local_f38 = local_1858;
  uStack_f30 = uStack_1850;
  local_f48 = local_17b8;
  iStack_f44 = iStack_17b4;
  iStack_f40 = iStack_17b0;
  iStack_f3c = iStack_17ac;
  iVar112 = (int)local_f18 + (int)local_f28 + local_17b8;
  iVar113 = local_f18._4_4_ + local_f28._4_4_ + iStack_17b4;
  iVar114 = (int)uStack_f10 + (int)uStack_f20 + iStack_17b0;
  iVar118 = uStack_f10._4_4_ + uStack_f20._4_4_ + iStack_17ac;
  local_1858 = CONCAT44(iVar113,iVar112);
  uStack_1850._0_4_ = iVar114;
  uStack_1850._4_4_ = iVar118;
  local_1458 = local_1858;
  uStack_1450 = uStack_1850;
  local_145c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  iVar112 = iVar112 >> auVar110;
  iVar113 = iVar113 >> auVar110;
  iVar114 = iVar114 >> auVar110;
  iVar118 = iVar118 >> auVar110;
  local_1858 = CONCAT44(iVar113,iVar112);
  uStack_1850._0_4_ = iVar114;
  uStack_1850._4_4_ = iVar118;
  local_a98 = local_18f8._0_8_;
  uStack_a90 = local_18f8._8_8_;
  local_aa8 = local_1908._0_8_;
  uStack_aa0 = local_1908._8_8_;
  local_1848 = CONCAT44(local_f18._4_4_ - local_f28._4_4_,(int)local_f18 - (int)local_f28);
  uStack_1840._0_4_ = (int)uStack_f10 - (int)uStack_f20;
  uStack_1840._4_4_ = uStack_f10._4_4_ - uStack_f20._4_4_;
  local_f58 = local_1848;
  uStack_f50 = uStack_1840;
  local_f68 = local_17b8;
  iStack_f64 = iStack_17b4;
  iStack_f60 = iStack_17b0;
  iStack_f5c = iStack_17ac;
  iVar116 = ((int)local_f18 - (int)local_f28) + local_17b8;
  iVar117 = (local_f18._4_4_ - local_f28._4_4_) + iStack_17b4;
  iVar115 = ((int)uStack_f10 - (int)uStack_f20) + iStack_17b0;
  iVar119 = (uStack_f10._4_4_ - uStack_f20._4_4_) + iStack_17ac;
  local_1848 = CONCAT44(iVar117,iVar116);
  uStack_1840._0_4_ = iVar115;
  uStack_1840._4_4_ = iVar119;
  local_1478 = local_1848;
  uStack_1470 = uStack_1840;
  local_147c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1848 = CONCAT44(iVar117 >> auVar110,iVar116 >> auVar110);
  uStack_1840._0_4_ = iVar115 >> auVar110;
  uStack_1840._4_4_ = iVar119 >> auVar110;
  local_5b8 = local_1898;
  uStack_5b0 = uStack_1890;
  local_5c8 = local_17a8;
  uStack_5c0 = uStack_17a0;
  auVar42._8_8_ = uStack_1890;
  auVar42._0_8_ = local_1898;
  auVar41._8_8_ = uStack_17a0;
  auVar41._0_8_ = local_17a8;
  local_18f8 = pmulld(auVar42,auVar41);
  local_5d8 = local_1888;
  uStack_5d0 = uStack_1880;
  local_5e8 = local_17a8;
  uStack_5e0 = uStack_17a0;
  auVar111._8_8_ = uStack_1880;
  auVar111._0_8_ = local_1888;
  auVar110._8_8_ = uStack_17a0;
  auVar110._0_8_ = local_17a8;
  local_1908 = pmulld(auVar111,auVar110);
  local_f78 = local_18f8._0_8_;
  uVar82 = local_f78;
  uStack_f70 = local_18f8._8_8_;
  uVar83 = uStack_f70;
  local_f88 = local_1908._0_8_;
  uVar80 = local_f88;
  uStack_f80 = local_1908._8_8_;
  uVar81 = uStack_f80;
  local_f78._0_4_ = local_18f8._0_4_;
  local_f78._4_4_ = local_18f8._4_4_;
  uStack_f70._0_4_ = local_18f8._8_4_;
  uStack_f70._4_4_ = local_18f8._12_4_;
  local_f88._0_4_ = local_1908._0_4_;
  local_f88._4_4_ = local_1908._4_4_;
  uStack_f80._0_4_ = local_1908._8_4_;
  uStack_f80._4_4_ = local_1908._12_4_;
  local_1818 = CONCAT44(local_f78._4_4_ + local_f88._4_4_,(int)local_f78 + (int)local_f88);
  uStack_1810._0_4_ = (int)uStack_f70 + (int)uStack_f80;
  uStack_1810._4_4_ = uStack_f70._4_4_ + uStack_f80._4_4_;
  local_f98 = local_1818;
  uStack_f90 = uStack_1810;
  local_fa8 = local_17b8;
  iStack_fa4 = iStack_17b4;
  iStack_fa0 = iStack_17b0;
  iStack_f9c = iStack_17ac;
  iVar116 = (int)local_f78 + (int)local_f88 + local_17b8;
  iVar117 = local_f78._4_4_ + local_f88._4_4_ + iStack_17b4;
  iVar115 = (int)uStack_f70 + (int)uStack_f80 + iStack_17b0;
  iVar119 = uStack_f70._4_4_ + uStack_f80._4_4_ + iStack_17ac;
  local_1818 = CONCAT44(iVar117,iVar116);
  uStack_1810._0_4_ = iVar115;
  uStack_1810._4_4_ = iVar119;
  local_1498 = local_1818;
  uStack_1490 = uStack_1810;
  local_149c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1818 = CONCAT44(iVar117 >> auVar110,iVar116 >> auVar110);
  uStack_1810._0_4_ = iVar115 >> auVar110;
  uStack_1810._4_4_ = iVar119 >> auVar110;
  local_ab8 = local_18f8._0_8_;
  uStack_ab0 = local_18f8._8_8_;
  local_ac8 = local_1908._0_8_;
  uStack_ac0 = local_1908._8_8_;
  local_1808 = CONCAT44(local_f78._4_4_ - local_f88._4_4_,(int)local_f78 - (int)local_f88);
  uStack_1800._0_4_ = (int)uStack_f70 - (int)uStack_f80;
  uStack_1800._4_4_ = uStack_f70._4_4_ - uStack_f80._4_4_;
  local_fb8 = local_1808;
  uStack_fb0 = uStack_1800;
  local_fc8 = local_17b8;
  iStack_fc4 = iStack_17b4;
  iStack_fc0 = iStack_17b0;
  iStack_fbc = iStack_17ac;
  iVar116 = ((int)local_f78 - (int)local_f88) + local_17b8;
  iVar117 = (local_f78._4_4_ - local_f88._4_4_) + iStack_17b4;
  iVar115 = ((int)uStack_f70 - (int)uStack_f80) + iStack_17b0;
  iVar119 = (uStack_f70._4_4_ - uStack_f80._4_4_) + iStack_17ac;
  local_1808 = CONCAT44(iVar117,iVar116);
  uStack_1800._0_4_ = iVar115;
  uStack_1800._4_4_ = iVar119;
  local_14b8 = local_1808;
  uStack_14b0 = uStack_1800;
  local_14bc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  iVar116 = iVar116 >> auVar110;
  iVar117 = iVar117 >> auVar110;
  iVar115 = iVar115 >> auVar110;
  iVar119 = iVar119 >> auVar110;
  local_1808 = CONCAT44(iVar117,iVar116);
  uStack_1800._0_4_ = iVar115;
  uStack_1800._4_4_ = iVar119;
  local_f88 = uVar80;
  uStack_f80 = uVar81;
  local_f78 = uVar82;
  uStack_f70 = uVar83;
  local_f28 = uVar84;
  uStack_f20 = uVar85;
  local_f18 = uVar86;
  uStack_f10 = uVar87;
  if (local_16d8 == 0) {
    if (local_16dc + 6 < 0x10) {
      in_stack_ffffffffffffe690 = 0x10;
    }
    else {
      in_stack_ffffffffffffe690 = local_16dc + 6;
    }
    local_190c._0_1_ = (char)in_stack_ffffffffffffe690;
    local_9a8 = -(1 << ((char)local_190c - 1U & 0x1f));
    local_1928 = CONCAT44(local_9a8,local_9a8);
    uStack_1920 = CONCAT44(local_9a8,local_9a8);
    local_9ac = (1 << ((char)local_190c - 1U & 0x1f)) + -1;
    local_1938 = CONCAT44(local_9ac,local_9ac);
    uStack_1930 = CONCAT44(local_9ac,local_9ac);
    in0_07[1] = local_16d0 + 4;
    in0_07[0] = (longlong)local_16d0;
    in1_07[1] = (longlong)&local_1938;
    in1_07[0] = (longlong)&local_1928;
    local_190c = in_stack_ffffffffffffe690;
    local_88 = local_1928;
    uStack_80 = uStack_1920;
    local_78 = local_9a8;
    local_74 = local_9a8;
    local_70 = local_9a8;
    local_6c = local_9a8;
    local_68 = local_1938;
    uStack_60 = uStack_1930;
    local_58 = local_9ac;
    local_54 = local_9ac;
    local_50 = local_9ac;
    local_4c = local_9ac;
    neg_shift_sse4_1(in0_07,in1_07,(__m128i *)(ulong)local_16e0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                     (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                     (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690),
                     in_stack_ffffffffffffe698);
    in0_08[0] = local_16d0 + 8;
    in0_08[1] = local_16d0 + 0xc;
    in1_08[1] = (longlong)&local_1938;
    in1_08[0] = (longlong)&local_1928;
    neg_shift_sse4_1(in0_08,in1_08,(__m128i *)(ulong)local_16e0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                     (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                     (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690),
                     in_stack_ffffffffffffe698);
    in0_09[0] = local_16d0 + 0x10;
    in0_09[1] = local_16d0 + 0x14;
    in1_09[1] = (longlong)&local_1938;
    in1_09[0] = (longlong)&local_1928;
    neg_shift_sse4_1(in0_09,in1_09,(__m128i *)(ulong)local_16e0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                     (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                     (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690),
                     in_stack_ffffffffffffe698);
    in0_10[0] = local_16d0 + 0x18;
    in0_10[1] = local_16d0 + 0x1c;
    in_R8 = (__m128i *)(ulong)local_16e0;
    in1_10[1] = (longlong)&local_1938;
    in1_10[0] = (longlong)&local_1928;
    neg_shift_sse4_1(in0_10,in1_10,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                     (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                     (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690),
                     in_stack_ffffffffffffe698);
  }
  else {
    *local_16d0 = uVar121;
    local_16d0[1] = uVar79;
    local_ad8 = local_17c8;
    uVar82 = local_ad8;
    uStack_ad0 = uStack_17c0;
    uVar83 = uStack_ad0;
    local_ae8 = local_18b8;
    uVar80 = local_ae8;
    uStack_ae0 = uStack_18b0;
    uVar81 = uStack_ae0;
    local_ad8._0_4_ = (int)local_17c8;
    local_ad8._4_4_ = (int)((ulong)local_17c8 >> 0x20);
    uStack_ad0._0_4_ = (int)uStack_17c0;
    uStack_ad0._4_4_ = (int)((ulong)uStack_17c0 >> 0x20);
    local_ae8._0_4_ = (int)local_18b8;
    local_ae8._4_4_ = (int)((ulong)local_18b8 >> 0x20);
    uStack_ae0._0_4_ = (int)uStack_18b0;
    uStack_ae0._4_4_ = (int)((ulong)uStack_18b0 >> 0x20);
    *(int *)(local_16d0 + 4) = (int)local_ad8 - (int)local_ae8;
    *(int *)((long)local_16d0 + 0x24) = local_ad8._4_4_ - local_ae8._4_4_;
    *(int *)(local_16d0 + 5) = (int)uStack_ad0 - (int)uStack_ae0;
    *(int *)((long)local_16d0 + 0x2c) = uStack_ad0._4_4_ - uStack_ae0._4_4_;
    local_16d0[8] = local_1818;
    local_16d0[9] = uStack_1810;
    local_af8 = local_17c8;
    uStack_af0 = uStack_17c0;
    local_b08 = local_1858;
    uStack_b00 = uStack_1850;
    *(int *)(local_16d0 + 0xc) = (int)local_ad8 - iVar112;
    *(int *)((long)local_16d0 + 100) = local_ad8._4_4_ - iVar113;
    *(int *)(local_16d0 + 0xd) = (int)uStack_ad0 - iVar114;
    *(int *)((long)local_16d0 + 0x6c) = uStack_ad0._4_4_ - iVar118;
    local_16d0[0x10] = local_1848;
    local_16d0[0x11] = uStack_1840;
    local_b18 = local_17c8;
    uStack_b10 = uStack_17c0;
    local_b28 = local_1808;
    uStack_b20 = uStack_1800;
    *(int *)(local_16d0 + 0x14) = (int)local_ad8 - iVar116;
    *(int *)((long)local_16d0 + 0xa4) = local_ad8._4_4_ - iVar117;
    *(int *)(local_16d0 + 0x15) = (int)uStack_ad0 - iVar115;
    *(int *)((long)local_16d0 + 0xac) = uStack_ad0._4_4_ - iVar119;
    local_16d0[0x18] = local_18a8;
    local_16d0[0x19] = uStack_18a0;
    local_b38 = local_17c8;
    uStack_b30 = uStack_17c0;
    local_b48 = local_18e8;
    uVar121 = local_b48;
    uStack_b40 = uStack_18e0;
    uVar79 = uStack_b40;
    local_b48._0_4_ = (int)local_18e8;
    local_b48._4_4_ = (int)((ulong)local_18e8 >> 0x20);
    uStack_b40._0_4_ = (int)uStack_18e0;
    uStack_b40._4_4_ = (int)((ulong)uStack_18e0 >> 0x20);
    *(int *)(local_16d0 + 0x1c) = (int)local_ad8 - (int)local_b48;
    *(int *)((long)local_16d0 + 0xe4) = local_ad8._4_4_ - local_b48._4_4_;
    *(int *)(local_16d0 + 0x1d) = (int)uStack_ad0 - (int)uStack_b40;
    *(int *)((long)local_16d0 + 0xec) = uStack_ad0._4_4_ - uStack_b40._4_4_;
    local_b48 = uVar121;
    uStack_b40 = uVar79;
    local_ae8 = uVar80;
    uStack_ae0 = uVar81;
    local_ad8 = uVar82;
    uStack_ad0 = uVar83;
  }
  local_5f8 = *(undefined8 *)local_16c8[0xf];
  uStack_5f0 = *(undefined8 *)(local_16c8[0xf] + 8);
  local_608 = local_16f8;
  uStack_600 = uStack_16f0;
  auVar40._8_8_ = uStack_16f0;
  auVar40._0_8_ = local_16f8;
  auVar110 = pmulld(local_16c8[0xf],auVar40);
  local_618 = *(undefined8 *)local_16c8[1];
  uStack_610 = *(undefined8 *)(local_16c8[1] + 8);
  local_628 = local_1708;
  uStack_620 = uStack_1700;
  auVar39._8_8_ = uStack_1700;
  auVar39._0_8_ = local_1708;
  auVar111 = pmulld(local_16c8[1],auVar39);
  local_1878._0_8_ = auVar110._0_8_;
  local_1878._8_8_ = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_fd8 = local_1878._0_8_;
  uVar92 = local_fd8;
  uStack_fd0 = local_1878._8_8_;
  uVar93 = uStack_fd0;
  local_fe8 = local_1908._0_8_;
  uVar90 = local_fe8;
  uStack_fe0 = local_1908._8_8_;
  uVar91 = uStack_fe0;
  local_fd8._0_4_ = auVar110._0_4_;
  local_fd8._4_4_ = auVar110._4_4_;
  uStack_fd0._0_4_ = auVar110._8_4_;
  uStack_fd0._4_4_ = auVar110._12_4_;
  local_fe8._0_4_ = auVar111._0_4_;
  local_fe8._4_4_ = auVar111._4_4_;
  uStack_fe0._0_4_ = auVar111._8_4_;
  uStack_fe0._4_4_ = auVar111._12_4_;
  local_1878._4_4_ = local_fd8._4_4_ + local_fe8._4_4_;
  local_1878._0_4_ = (int)local_fd8 + (int)local_fe8;
  local_1878._8_4_ = (int)uStack_fd0 + (int)uStack_fe0;
  local_1878._12_4_ = uStack_fd0._4_4_ + uStack_fe0._4_4_;
  local_ff8 = local_1878._0_8_;
  uStack_ff0 = local_1878._8_8_;
  local_1008 = local_17b8;
  iStack_1004 = iStack_17b4;
  iStack_1000 = iStack_17b0;
  iStack_ffc = iStack_17ac;
  local_1878._0_4_ = (int)local_fd8 + (int)local_fe8 + local_17b8;
  local_1878._4_4_ = local_fd8._4_4_ + local_fe8._4_4_ + iStack_17b4;
  iVar112 = (int)uStack_fd0 + (int)uStack_fe0 + iStack_17b0;
  iVar116 = uStack_fd0._4_4_ + uStack_fe0._4_4_ + iStack_17ac;
  local_1878._8_4_ = iVar112;
  local_1878._12_4_ = iVar116;
  local_14d8 = local_1878._0_8_;
  uStack_14d0 = local_1878._8_8_;
  local_14dc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1878._4_4_ = (int)local_1878._4_4_ >> auVar110;
  local_1878._0_4_ = (int)local_1878._0_4_ >> auVar110;
  local_1878._8_4_ = iVar112 >> auVar110;
  local_1878._12_4_ = iVar116 >> auVar110;
  local_638 = *(undefined8 *)local_16c8[0xf];
  uStack_630 = *(undefined8 *)(local_16c8[0xf] + 8);
  local_648 = local_1708;
  uStack_640 = uStack_1700;
  auVar38._8_8_ = uStack_1700;
  auVar38._0_8_ = local_1708;
  auVar110 = pmulld(local_16c8[0xf],auVar38);
  local_658 = *(undefined8 *)local_16c8[1];
  uStack_650 = *(undefined8 *)(local_16c8[1] + 8);
  local_668 = local_16f8;
  uStack_660 = uStack_16f0;
  auVar37._8_8_ = uStack_16f0;
  auVar37._0_8_ = local_16f8;
  auVar111 = pmulld(local_16c8[1],auVar37);
  local_1868 = auVar110._0_8_;
  uStack_1860 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_b58 = local_1868;
  uVar108 = local_b58;
  uStack_b50 = uStack_1860;
  uVar109 = uStack_b50;
  local_b68 = local_1908._0_8_;
  uVar106 = local_b68;
  uStack_b60 = local_1908._8_8_;
  uVar107 = uStack_b60;
  local_b58._0_4_ = auVar110._0_4_;
  local_b58._4_4_ = auVar110._4_4_;
  uStack_b50._0_4_ = auVar110._8_4_;
  uStack_b50._4_4_ = auVar110._12_4_;
  local_b68._0_4_ = auVar111._0_4_;
  local_b68._4_4_ = auVar111._4_4_;
  uStack_b60._0_4_ = auVar111._8_4_;
  uStack_b60._4_4_ = auVar111._12_4_;
  local_1868 = CONCAT44(local_b58._4_4_ - local_b68._4_4_,(int)local_b58 - (int)local_b68);
  uStack_1860._0_4_ = (int)uStack_b50 - (int)uStack_b60;
  uStack_1860._4_4_ = uStack_b50._4_4_ - uStack_b60._4_4_;
  local_1018 = local_1868;
  uStack_1010 = uStack_1860;
  local_1028 = local_17b8;
  iStack_1024 = iStack_17b4;
  iStack_1020 = iStack_17b0;
  iStack_101c = iStack_17ac;
  iVar112 = ((int)local_b58 - (int)local_b68) + local_17b8;
  iVar116 = (local_b58._4_4_ - local_b68._4_4_) + iStack_17b4;
  iVar113 = ((int)uStack_b50 - (int)uStack_b60) + iStack_17b0;
  iVar117 = (uStack_b50._4_4_ - uStack_b60._4_4_) + iStack_17ac;
  local_1868 = CONCAT44(iVar116,iVar112);
  uStack_1860._0_4_ = iVar113;
  uStack_1860._4_4_ = iVar117;
  local_14f8 = local_1868;
  uStack_14f0 = uStack_1860;
  local_14fc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1868._4_4_ = iVar116 >> auVar110;
  local_1868._0_4_ = iVar112 >> auVar110;
  uStack_1860._0_4_ = iVar113 >> auVar110;
  uStack_1860._4_4_ = iVar117 >> auVar110;
  local_678 = *(undefined8 *)local_16c8[0xb];
  uStack_670 = *(undefined8 *)(local_16c8[0xb] + 8);
  local_688 = local_1718;
  uStack_680 = uStack_1710;
  auVar36._8_8_ = uStack_1710;
  auVar36._0_8_ = local_1718;
  auVar110 = pmulld(local_16c8[0xb],auVar36);
  local_698 = *(undefined8 *)local_16c8[5];
  uStack_690 = *(undefined8 *)(local_16c8[5] + 8);
  local_6a8 = local_1728;
  uStack_6a0 = uStack_1720;
  auVar35._8_8_ = uStack_1720;
  auVar35._0_8_ = local_1728;
  auVar111 = pmulld(local_16c8[5],auVar35);
  local_1858 = auVar110._0_8_;
  uStack_1850 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_1038 = local_1858;
  uVar88 = local_1038;
  uStack_1030 = uStack_1850;
  uVar89 = uStack_1030;
  local_1048 = local_1908._0_8_;
  uVar86 = local_1048;
  uStack_1040 = local_1908._8_8_;
  uVar87 = uStack_1040;
  local_1038._0_4_ = auVar110._0_4_;
  local_1038._4_4_ = auVar110._4_4_;
  uStack_1030._0_4_ = auVar110._8_4_;
  uStack_1030._4_4_ = auVar110._12_4_;
  local_1048._0_4_ = auVar111._0_4_;
  local_1048._4_4_ = auVar111._4_4_;
  uStack_1040._0_4_ = auVar111._8_4_;
  uStack_1040._4_4_ = auVar111._12_4_;
  local_1858 = CONCAT44(local_1038._4_4_ + local_1048._4_4_,(int)local_1038 + (int)local_1048);
  uStack_1850._0_4_ = (int)uStack_1030 + (int)uStack_1040;
  uStack_1850._4_4_ = uStack_1030._4_4_ + uStack_1040._4_4_;
  local_1058 = local_1858;
  uStack_1050 = uStack_1850;
  local_1068 = local_17b8;
  iStack_1064 = iStack_17b4;
  iStack_1060 = iStack_17b0;
  iStack_105c = iStack_17ac;
  iVar112 = (int)local_1038 + (int)local_1048 + local_17b8;
  iVar116 = local_1038._4_4_ + local_1048._4_4_ + iStack_17b4;
  iVar113 = (int)uStack_1030 + (int)uStack_1040 + iStack_17b0;
  iVar117 = uStack_1030._4_4_ + uStack_1040._4_4_ + iStack_17ac;
  local_1858 = CONCAT44(iVar116,iVar112);
  uStack_1850._0_4_ = iVar113;
  uStack_1850._4_4_ = iVar117;
  local_1518 = local_1858;
  uStack_1510 = uStack_1850;
  local_151c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1858._4_4_ = iVar116 >> auVar110;
  local_1858._0_4_ = iVar112 >> auVar110;
  uStack_1850._0_4_ = iVar113 >> auVar110;
  uStack_1850._4_4_ = iVar117 >> auVar110;
  local_6b8 = *(undefined8 *)local_16c8[0xb];
  uStack_6b0 = *(undefined8 *)(local_16c8[0xb] + 8);
  local_6c8 = local_1728;
  uStack_6c0 = uStack_1720;
  auVar34._8_8_ = uStack_1720;
  auVar34._0_8_ = local_1728;
  auVar110 = pmulld(local_16c8[0xb],auVar34);
  local_6d8 = *(undefined8 *)local_16c8[5];
  uStack_6d0 = *(undefined8 *)(local_16c8[5] + 8);
  local_6e8 = local_1718;
  uStack_6e0 = uStack_1710;
  auVar33._8_8_ = uStack_1710;
  auVar33._0_8_ = local_1718;
  auVar111 = pmulld(local_16c8[5],auVar33);
  local_1848 = auVar110._0_8_;
  uStack_1840 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_b78 = local_1848;
  uVar104 = local_b78;
  uStack_b70 = uStack_1840;
  uVar105 = uStack_b70;
  local_b88 = local_1908._0_8_;
  uVar102 = local_b88;
  uStack_b80 = local_1908._8_8_;
  uVar103 = uStack_b80;
  local_b78._0_4_ = auVar110._0_4_;
  local_b78._4_4_ = auVar110._4_4_;
  uStack_b70._0_4_ = auVar110._8_4_;
  uStack_b70._4_4_ = auVar110._12_4_;
  local_b88._0_4_ = auVar111._0_4_;
  local_b88._4_4_ = auVar111._4_4_;
  uStack_b80._0_4_ = auVar111._8_4_;
  uStack_b80._4_4_ = auVar111._12_4_;
  local_1848 = CONCAT44(local_b78._4_4_ - local_b88._4_4_,(int)local_b78 - (int)local_b88);
  uStack_1840._0_4_ = (int)uStack_b70 - (int)uStack_b80;
  uStack_1840._4_4_ = uStack_b70._4_4_ - uStack_b80._4_4_;
  local_1078 = local_1848;
  uStack_1070 = uStack_1840;
  local_1088 = local_17b8;
  iStack_1084 = iStack_17b4;
  iStack_1080 = iStack_17b0;
  iStack_107c = iStack_17ac;
  iVar112 = ((int)local_b78 - (int)local_b88) + local_17b8;
  iVar116 = (local_b78._4_4_ - local_b88._4_4_) + iStack_17b4;
  iVar113 = ((int)uStack_b70 - (int)uStack_b80) + iStack_17b0;
  iVar117 = (uStack_b70._4_4_ - uStack_b80._4_4_) + iStack_17ac;
  local_1848 = CONCAT44(iVar116,iVar112);
  uStack_1840._0_4_ = iVar113;
  uStack_1840._4_4_ = iVar117;
  local_1538 = local_1848;
  uStack_1530 = uStack_1840;
  local_153c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1848._4_4_ = iVar116 >> auVar110;
  local_1848._0_4_ = iVar112 >> auVar110;
  uStack_1840._0_4_ = iVar113 >> auVar110;
  uStack_1840._4_4_ = iVar117 >> auVar110;
  local_6f8 = *(undefined8 *)local_16c8[7];
  uStack_6f0 = *(undefined8 *)(local_16c8[7] + 8);
  local_708 = local_1738;
  uStack_700 = uStack_1730;
  auVar32._8_8_ = uStack_1730;
  auVar32._0_8_ = local_1738;
  auVar110 = pmulld(local_16c8[7],auVar32);
  local_718 = *(undefined8 *)local_16c8[9];
  uStack_710 = *(undefined8 *)(local_16c8[9] + 8);
  local_728 = local_1748;
  uStack_720 = uStack_1740;
  auVar31._8_8_ = uStack_1740;
  auVar31._0_8_ = local_1748;
  auVar111 = pmulld(local_16c8[9],auVar31);
  local_1838 = auVar110._0_8_;
  uStack_1830 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_1098 = local_1838;
  uVar84 = local_1098;
  uStack_1090 = uStack_1830;
  uVar85 = uStack_1090;
  local_10a8 = local_1908._0_8_;
  uVar82 = local_10a8;
  uStack_10a0 = local_1908._8_8_;
  uVar83 = uStack_10a0;
  local_1098._0_4_ = auVar110._0_4_;
  local_1098._4_4_ = auVar110._4_4_;
  uStack_1090._0_4_ = auVar110._8_4_;
  uStack_1090._4_4_ = auVar110._12_4_;
  local_10a8._0_4_ = auVar111._0_4_;
  local_10a8._4_4_ = auVar111._4_4_;
  uStack_10a0._0_4_ = auVar111._8_4_;
  uStack_10a0._4_4_ = auVar111._12_4_;
  local_1838 = CONCAT44(local_1098._4_4_ + local_10a8._4_4_,(int)local_1098 + (int)local_10a8);
  uStack_1830._0_4_ = (int)uStack_1090 + (int)uStack_10a0;
  uStack_1830._4_4_ = uStack_1090._4_4_ + uStack_10a0._4_4_;
  local_10b8 = local_1838;
  uStack_10b0 = uStack_1830;
  local_10c8 = local_17b8;
  iStack_10c4 = iStack_17b4;
  iStack_10c0 = iStack_17b0;
  iStack_10bc = iStack_17ac;
  iVar112 = (int)local_1098 + (int)local_10a8 + local_17b8;
  iVar116 = local_1098._4_4_ + local_10a8._4_4_ + iStack_17b4;
  iVar113 = (int)uStack_1090 + (int)uStack_10a0 + iStack_17b0;
  iVar117 = uStack_1090._4_4_ + uStack_10a0._4_4_ + iStack_17ac;
  local_1838 = CONCAT44(iVar116,iVar112);
  uStack_1830._0_4_ = iVar113;
  uStack_1830._4_4_ = iVar117;
  local_1558 = local_1838;
  uStack_1550 = uStack_1830;
  local_155c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1838._4_4_ = iVar116 >> auVar110;
  local_1838._0_4_ = iVar112 >> auVar110;
  uStack_1830._0_4_ = iVar113 >> auVar110;
  uStack_1830._4_4_ = iVar117 >> auVar110;
  local_738 = *(undefined8 *)local_16c8[7];
  uStack_730 = *(undefined8 *)(local_16c8[7] + 8);
  local_748 = local_1748;
  uStack_740 = uStack_1740;
  auVar30._8_8_ = uStack_1740;
  auVar30._0_8_ = local_1748;
  auVar110 = pmulld(local_16c8[7],auVar30);
  local_758 = *(undefined8 *)local_16c8[9];
  uStack_750 = *(undefined8 *)(local_16c8[9] + 8);
  local_768 = local_1738;
  uStack_760 = uStack_1730;
  auVar29._8_8_ = uStack_1730;
  auVar29._0_8_ = local_1738;
  auVar111 = pmulld(local_16c8[9],auVar29);
  local_1828 = auVar110._0_8_;
  uStack_1820 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_b98 = local_1828;
  uVar100 = local_b98;
  uStack_b90 = uStack_1820;
  uVar101 = uStack_b90;
  local_ba8 = local_1908._0_8_;
  uVar98 = local_ba8;
  uStack_ba0 = local_1908._8_8_;
  uVar99 = uStack_ba0;
  local_b98._0_4_ = auVar110._0_4_;
  local_b98._4_4_ = auVar110._4_4_;
  uStack_b90._0_4_ = auVar110._8_4_;
  uStack_b90._4_4_ = auVar110._12_4_;
  local_ba8._0_4_ = auVar111._0_4_;
  local_ba8._4_4_ = auVar111._4_4_;
  uStack_ba0._0_4_ = auVar111._8_4_;
  uStack_ba0._4_4_ = auVar111._12_4_;
  local_1828 = CONCAT44(local_b98._4_4_ - local_ba8._4_4_,(int)local_b98 - (int)local_ba8);
  uStack_1820._0_4_ = (int)uStack_b90 - (int)uStack_ba0;
  uStack_1820._4_4_ = uStack_b90._4_4_ - uStack_ba0._4_4_;
  local_10d8 = local_1828;
  uStack_10d0 = uStack_1820;
  local_10e8 = local_17b8;
  iStack_10e4 = iStack_17b4;
  iStack_10e0 = iStack_17b0;
  iStack_10dc = iStack_17ac;
  iVar112 = ((int)local_b98 - (int)local_ba8) + local_17b8;
  iVar116 = (local_b98._4_4_ - local_ba8._4_4_) + iStack_17b4;
  iVar113 = ((int)uStack_b90 - (int)uStack_ba0) + iStack_17b0;
  iVar117 = (uStack_b90._4_4_ - uStack_ba0._4_4_) + iStack_17ac;
  local_1828 = CONCAT44(iVar116,iVar112);
  uStack_1820._0_4_ = iVar113;
  uStack_1820._4_4_ = iVar117;
  local_1578 = local_1828;
  uStack_1570 = uStack_1820;
  local_157c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1828._4_4_ = iVar116 >> auVar110;
  local_1828._0_4_ = iVar112 >> auVar110;
  uStack_1820._0_4_ = iVar113 >> auVar110;
  uStack_1820._4_4_ = iVar117 >> auVar110;
  local_778 = *(undefined8 *)local_16c8[3];
  uStack_770 = *(undefined8 *)(local_16c8[3] + 8);
  local_788 = local_1758;
  uStack_780 = uStack_1750;
  auVar28._8_8_ = uStack_1750;
  auVar28._0_8_ = local_1758;
  auVar110 = pmulld(local_16c8[3],auVar28);
  local_798 = *(undefined8 *)local_16c8[0xd];
  uStack_790 = *(undefined8 *)(local_16c8[0xd] + 8);
  local_7a8 = local_1768;
  uStack_7a0 = uStack_1760;
  auVar27._8_8_ = uStack_1760;
  auVar27._0_8_ = local_1768;
  auVar111 = pmulld(local_16c8[0xd],auVar27);
  local_1818 = auVar110._0_8_;
  uStack_1810 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_10f8 = local_1818;
  uVar80 = local_10f8;
  uStack_10f0 = uStack_1810;
  uVar81 = uStack_10f0;
  local_1108 = local_1908._0_8_;
  uVar121 = local_1108;
  uStack_1100 = local_1908._8_8_;
  uVar79 = uStack_1100;
  local_10f8._0_4_ = auVar110._0_4_;
  local_10f8._4_4_ = auVar110._4_4_;
  uStack_10f0._0_4_ = auVar110._8_4_;
  uStack_10f0._4_4_ = auVar110._12_4_;
  local_1108._0_4_ = auVar111._0_4_;
  local_1108._4_4_ = auVar111._4_4_;
  uStack_1100._0_4_ = auVar111._8_4_;
  uStack_1100._4_4_ = auVar111._12_4_;
  local_1818 = CONCAT44(local_10f8._4_4_ + local_1108._4_4_,(int)local_10f8 + (int)local_1108);
  uStack_1810._0_4_ = (int)uStack_10f0 + (int)uStack_1100;
  uStack_1810._4_4_ = uStack_10f0._4_4_ + uStack_1100._4_4_;
  local_1118 = local_1818;
  uStack_1110 = uStack_1810;
  local_1128 = local_17b8;
  iStack_1124 = iStack_17b4;
  iStack_1120 = iStack_17b0;
  iStack_111c = iStack_17ac;
  iVar112 = (int)local_10f8 + (int)local_1108 + local_17b8;
  iVar116 = local_10f8._4_4_ + local_1108._4_4_ + iStack_17b4;
  iVar113 = (int)uStack_10f0 + (int)uStack_1100 + iStack_17b0;
  iVar117 = uStack_10f0._4_4_ + uStack_1100._4_4_ + iStack_17ac;
  local_1818 = CONCAT44(iVar116,iVar112);
  uStack_1810._0_4_ = iVar113;
  uStack_1810._4_4_ = iVar117;
  local_1598 = local_1818;
  uStack_1590 = uStack_1810;
  local_159c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1818._4_4_ = iVar116 >> auVar110;
  local_1818._0_4_ = iVar112 >> auVar110;
  uStack_1810._0_4_ = iVar113 >> auVar110;
  uStack_1810._4_4_ = iVar117 >> auVar110;
  local_7b8 = *(undefined8 *)local_16c8[3];
  uStack_7b0 = *(undefined8 *)(local_16c8[3] + 8);
  local_7c8 = local_1768;
  uStack_7c0 = uStack_1760;
  auVar26._8_8_ = uStack_1760;
  auVar26._0_8_ = local_1768;
  auVar110 = pmulld(local_16c8[3],auVar26);
  local_7d8 = *(undefined8 *)local_16c8[0xd];
  uStack_7d0 = *(undefined8 *)(local_16c8[0xd] + 8);
  local_7e8 = local_1758;
  uStack_7e0 = uStack_1750;
  auVar25._8_8_ = uStack_1750;
  auVar25._0_8_ = local_1758;
  local_1908 = pmulld(local_16c8[0xd],auVar25);
  local_1808 = auVar110._0_8_;
  uStack_1800 = auVar110._8_8_;
  local_bb8 = local_1808;
  uVar96 = local_bb8;
  uStack_bb0 = uStack_1800;
  uVar97 = uStack_bb0;
  local_bc8 = local_1908._0_8_;
  uVar94 = local_bc8;
  uStack_bc0 = local_1908._8_8_;
  uVar95 = uStack_bc0;
  local_bb8._0_4_ = auVar110._0_4_;
  local_bb8._4_4_ = auVar110._4_4_;
  uStack_bb0._0_4_ = auVar110._8_4_;
  uStack_bb0._4_4_ = auVar110._12_4_;
  local_bc8._0_4_ = local_1908._0_4_;
  local_bc8._4_4_ = local_1908._4_4_;
  uStack_bc0._0_4_ = local_1908._8_4_;
  uStack_bc0._4_4_ = local_1908._12_4_;
  local_1808 = CONCAT44(local_bb8._4_4_ - local_bc8._4_4_,(int)local_bb8 - (int)local_bc8);
  uStack_1800._0_4_ = (int)uStack_bb0 - (int)uStack_bc0;
  uStack_1800._4_4_ = uStack_bb0._4_4_ - uStack_bc0._4_4_;
  local_1138 = local_1808;
  uStack_1130 = uStack_1800;
  local_1148 = local_17b8;
  iStack_1144 = iStack_17b4;
  iStack_1140 = iStack_17b0;
  iStack_113c = iStack_17ac;
  iVar112 = ((int)local_bb8 - (int)local_bc8) + local_17b8;
  iVar116 = (local_bb8._4_4_ - local_bc8._4_4_) + iStack_17b4;
  iVar113 = ((int)uStack_bb0 - (int)uStack_bc0) + iStack_17b0;
  iVar117 = (uStack_bb0._4_4_ - uStack_bc0._4_4_) + iStack_17ac;
  local_1808 = CONCAT44(iVar116,iVar112);
  uStack_1800._0_4_ = iVar113;
  uStack_1800._4_4_ = iVar117;
  local_15b8 = local_1808;
  uStack_15b0 = uStack_1800;
  local_15bc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1808._4_4_ = iVar116 >> auVar110;
  local_1808._0_4_ = iVar112 >> auVar110;
  uStack_1800._0_4_ = iVar113 >> auVar110;
  uStack_1800._4_4_ = iVar117 >> auVar110;
  in0_11[1] = &local_18b8;
  in0_11[0] = (longlong)local_18f8;
  in1_11[1] = (longlong)&local_17f8;
  in1_11[0] = (longlong)&local_17e8;
  local_1108 = uVar121;
  uStack_1100 = uVar79;
  local_10f8 = uVar80;
  uStack_10f0 = uVar81;
  local_10a8 = uVar82;
  uStack_10a0 = uVar83;
  local_1098 = uVar84;
  uStack_1090 = uVar85;
  local_1048 = uVar86;
  uStack_1040 = uVar87;
  local_1038 = uVar88;
  uStack_1030 = uVar89;
  local_fe8 = uVar90;
  uStack_fe0 = uVar91;
  local_fd8 = uVar92;
  uStack_fd0 = uVar93;
  local_bc8 = uVar94;
  uStack_bc0 = uVar95;
  local_bb8 = uVar96;
  uStack_bb0 = uVar97;
  local_ba8 = uVar98;
  uStack_ba0 = uVar99;
  local_b98 = uVar100;
  uStack_b90 = uVar101;
  local_b88 = uVar102;
  uStack_b80 = uVar103;
  local_b78 = uVar104;
  uStack_b70 = uVar105;
  local_b68 = uVar106;
  uStack_b60 = uVar107;
  local_b58 = uVar108;
  uStack_b50 = uVar109;
  addsub_sse4_1(in0_11,in1_11,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_12[0] = &local_18e8;
  in0_12[1] = &local_18a8;
  in1_12[1] = (longlong)&local_17f8;
  in1_12[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_12,in1_12,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_13[0] = &local_18d8;
  in0_13[1] = &local_1898;
  in1_13[1] = (longlong)&local_17f8;
  in1_13[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_13,in1_13,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_14[0] = &local_18c8;
  in0_14[1] = &local_1888;
  in1_14[1] = (longlong)&local_17f8;
  in1_14[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_14,in1_14,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  local_1878._0_8_ = local_18f8._0_8_;
  local_1878._8_8_ = local_18f8._8_8_;
  local_7f8 = local_18b8;
  uStack_7f0 = uStack_18b0;
  local_808 = local_1778;
  uStack_800 = uStack_1770;
  auVar24._8_8_ = uStack_18b0;
  auVar24._0_8_ = local_18b8;
  auVar23._8_8_ = uStack_1770;
  auVar23._0_8_ = local_1778;
  auVar110 = pmulld(auVar24,auVar23);
  local_818 = local_18a8;
  uStack_810 = uStack_18a0;
  local_828 = local_1788;
  uStack_820 = uStack_1780;
  auVar22._8_8_ = uStack_18a0;
  auVar22._0_8_ = local_18a8;
  auVar21._8_8_ = uStack_1780;
  auVar21._0_8_ = local_1788;
  auVar111 = pmulld(auVar22,auVar21);
  local_1838 = auVar110._0_8_;
  uStack_1830 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_1158 = local_1838;
  uVar84 = local_1158;
  uStack_1150 = uStack_1830;
  uVar85 = uStack_1150;
  local_1168 = local_1908._0_8_;
  uVar82 = local_1168;
  uStack_1160 = local_1908._8_8_;
  uVar83 = uStack_1160;
  local_1158._0_4_ = auVar110._0_4_;
  local_1158._4_4_ = auVar110._4_4_;
  uStack_1150._0_4_ = auVar110._8_4_;
  uStack_1150._4_4_ = auVar110._12_4_;
  local_1168._0_4_ = auVar111._0_4_;
  local_1168._4_4_ = auVar111._4_4_;
  uStack_1160._0_4_ = auVar111._8_4_;
  uStack_1160._4_4_ = auVar111._12_4_;
  local_1838 = CONCAT44(local_1158._4_4_ + local_1168._4_4_,(int)local_1158 + (int)local_1168);
  uStack_1830._0_4_ = (int)uStack_1150 + (int)uStack_1160;
  uStack_1830._4_4_ = uStack_1150._4_4_ + uStack_1160._4_4_;
  local_1178 = local_1838;
  uStack_1170 = uStack_1830;
  local_1188 = local_17b8;
  iStack_1184 = iStack_17b4;
  iStack_1180 = iStack_17b0;
  iStack_117c = iStack_17ac;
  iVar112 = (int)local_1158 + (int)local_1168 + local_17b8;
  iVar116 = local_1158._4_4_ + local_1168._4_4_ + iStack_17b4;
  iVar113 = (int)uStack_1150 + (int)uStack_1160 + iStack_17b0;
  iVar117 = uStack_1150._4_4_ + uStack_1160._4_4_ + iStack_17ac;
  local_1838 = CONCAT44(iVar116,iVar112);
  uStack_1830._0_4_ = iVar113;
  uStack_1830._4_4_ = iVar117;
  local_15d8 = local_1838;
  uStack_15d0 = uStack_1830;
  local_15dc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1838._4_4_ = iVar116 >> auVar110;
  local_1838._0_4_ = iVar112 >> auVar110;
  uStack_1830._0_4_ = iVar113 >> auVar110;
  uStack_1830._4_4_ = iVar117 >> auVar110;
  local_838 = local_18b8;
  uStack_830 = uStack_18b0;
  local_848 = local_1788;
  uStack_840 = uStack_1780;
  auVar20._8_8_ = uStack_18b0;
  auVar20._0_8_ = local_18b8;
  auVar19._8_8_ = uStack_1780;
  auVar19._0_8_ = local_1788;
  auVar110 = pmulld(auVar20,auVar19);
  local_858 = local_18a8;
  uStack_850 = uStack_18a0;
  local_868 = local_1778;
  uStack_860 = uStack_1770;
  auVar18._8_8_ = uStack_18a0;
  auVar18._0_8_ = local_18a8;
  auVar17._8_8_ = uStack_1770;
  auVar17._0_8_ = local_1778;
  auVar111 = pmulld(auVar18,auVar17);
  local_1828 = auVar110._0_8_;
  uStack_1820 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_bd8 = local_1828;
  uVar92 = local_bd8;
  uStack_bd0 = uStack_1820;
  uVar93 = uStack_bd0;
  local_be8 = local_1908._0_8_;
  uVar90 = local_be8;
  uStack_be0 = local_1908._8_8_;
  uVar91 = uStack_be0;
  local_bd8._0_4_ = auVar110._0_4_;
  local_bd8._4_4_ = auVar110._4_4_;
  uStack_bd0._0_4_ = auVar110._8_4_;
  uStack_bd0._4_4_ = auVar110._12_4_;
  local_be8._0_4_ = auVar111._0_4_;
  local_be8._4_4_ = auVar111._4_4_;
  uStack_be0._0_4_ = auVar111._8_4_;
  uStack_be0._4_4_ = auVar111._12_4_;
  local_1828 = CONCAT44(local_bd8._4_4_ - local_be8._4_4_,(int)local_bd8 - (int)local_be8);
  uStack_1820._0_4_ = (int)uStack_bd0 - (int)uStack_be0;
  uStack_1820._4_4_ = uStack_bd0._4_4_ - uStack_be0._4_4_;
  local_1198 = local_1828;
  uStack_1190 = uStack_1820;
  local_11a8 = local_17b8;
  iStack_11a4 = iStack_17b4;
  iStack_11a0 = iStack_17b0;
  iStack_119c = iStack_17ac;
  iVar112 = ((int)local_bd8 - (int)local_be8) + local_17b8;
  iVar116 = (local_bd8._4_4_ - local_be8._4_4_) + iStack_17b4;
  iVar113 = ((int)uStack_bd0 - (int)uStack_be0) + iStack_17b0;
  iVar117 = (uStack_bd0._4_4_ - uStack_be0._4_4_) + iStack_17ac;
  local_1828 = CONCAT44(iVar116,iVar112);
  uStack_1820._0_4_ = iVar113;
  uStack_1820._4_4_ = iVar117;
  local_15f8 = local_1828;
  uStack_15f0 = uStack_1820;
  local_15fc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1828._4_4_ = iVar116 >> auVar110;
  local_1828._0_4_ = iVar112 >> auVar110;
  uStack_1820._0_4_ = iVar113 >> auVar110;
  uStack_1820._4_4_ = iVar117 >> auVar110;
  local_878 = local_1898;
  uStack_870 = uStack_1890;
  local_888 = local_1798;
  uStack_880 = uStack_1790;
  auVar16._8_8_ = uStack_1890;
  auVar16._0_8_ = local_1898;
  auVar15._8_8_ = uStack_1790;
  auVar15._0_8_ = local_1798;
  auVar110 = pmulld(auVar16,auVar15);
  local_898 = local_1888;
  uStack_890 = uStack_1880;
  local_8a8 = local_1778;
  uStack_8a0 = uStack_1770;
  auVar14._8_8_ = uStack_1880;
  auVar14._0_8_ = local_1888;
  auVar13._8_8_ = uStack_1770;
  auVar13._0_8_ = local_1778;
  auVar111 = pmulld(auVar14,auVar13);
  local_1818 = auVar110._0_8_;
  uStack_1810 = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_11b8 = local_1818;
  uVar80 = local_11b8;
  uStack_11b0 = uStack_1810;
  uVar81 = uStack_11b0;
  local_11c8 = local_1908._0_8_;
  uVar121 = local_11c8;
  uStack_11c0 = local_1908._8_8_;
  uVar79 = uStack_11c0;
  local_11b8._0_4_ = auVar110._0_4_;
  local_11b8._4_4_ = auVar110._4_4_;
  uStack_11b0._0_4_ = auVar110._8_4_;
  uStack_11b0._4_4_ = auVar110._12_4_;
  local_11c8._0_4_ = auVar111._0_4_;
  local_11c8._4_4_ = auVar111._4_4_;
  uStack_11c0._0_4_ = auVar111._8_4_;
  uStack_11c0._4_4_ = auVar111._12_4_;
  local_1818 = CONCAT44(local_11b8._4_4_ + local_11c8._4_4_,(int)local_11b8 + (int)local_11c8);
  uStack_1810._0_4_ = (int)uStack_11b0 + (int)uStack_11c0;
  uStack_1810._4_4_ = uStack_11b0._4_4_ + uStack_11c0._4_4_;
  local_11d8 = local_1818;
  uStack_11d0 = uStack_1810;
  local_11e8 = local_17b8;
  iStack_11e4 = iStack_17b4;
  iStack_11e0 = iStack_17b0;
  iStack_11dc = iStack_17ac;
  iVar112 = (int)local_11b8 + (int)local_11c8 + local_17b8;
  iVar116 = local_11b8._4_4_ + local_11c8._4_4_ + iStack_17b4;
  iVar113 = (int)uStack_11b0 + (int)uStack_11c0 + iStack_17b0;
  iVar117 = uStack_11b0._4_4_ + uStack_11c0._4_4_ + iStack_17ac;
  local_1818 = CONCAT44(iVar116,iVar112);
  uStack_1810._0_4_ = iVar113;
  uStack_1810._4_4_ = iVar117;
  local_1618 = local_1818;
  uStack_1610 = uStack_1810;
  local_161c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1818._4_4_ = iVar116 >> auVar110;
  local_1818._0_4_ = iVar112 >> auVar110;
  uStack_1810._0_4_ = iVar113 >> auVar110;
  uStack_1810._4_4_ = iVar117 >> auVar110;
  local_8b8 = local_1898;
  uStack_8b0 = uStack_1890;
  local_8c8 = local_1778;
  uStack_8c0 = uStack_1770;
  auVar12._8_8_ = uStack_1890;
  auVar12._0_8_ = local_1898;
  auVar11._8_8_ = uStack_1770;
  auVar11._0_8_ = local_1778;
  auVar110 = pmulld(auVar12,auVar11);
  local_8d8 = local_1888;
  uStack_8d0 = uStack_1880;
  local_8e8 = local_1798;
  uStack_8e0 = uStack_1790;
  auVar10._8_8_ = uStack_1880;
  auVar10._0_8_ = local_1888;
  auVar9._8_8_ = uStack_1790;
  auVar9._0_8_ = local_1798;
  local_1908 = pmulld(auVar10,auVar9);
  local_1808 = auVar110._0_8_;
  uStack_1800 = auVar110._8_8_;
  local_bf8 = local_1808;
  uVar88 = local_bf8;
  uStack_bf0 = uStack_1800;
  uVar89 = uStack_bf0;
  local_c08 = local_1908._0_8_;
  uVar86 = local_c08;
  uStack_c00 = local_1908._8_8_;
  uVar87 = uStack_c00;
  local_bf8._0_4_ = auVar110._0_4_;
  local_bf8._4_4_ = auVar110._4_4_;
  uStack_bf0._0_4_ = auVar110._8_4_;
  uStack_bf0._4_4_ = auVar110._12_4_;
  local_c08._0_4_ = local_1908._0_4_;
  local_c08._4_4_ = local_1908._4_4_;
  uStack_c00._0_4_ = local_1908._8_4_;
  uStack_c00._4_4_ = local_1908._12_4_;
  local_1808 = CONCAT44(local_bf8._4_4_ - local_c08._4_4_,(int)local_bf8 - (int)local_c08);
  uStack_1800._0_4_ = (int)uStack_bf0 - (int)uStack_c00;
  uStack_1800._4_4_ = uStack_bf0._4_4_ - uStack_c00._4_4_;
  local_11f8 = local_1808;
  uStack_11f0 = uStack_1800;
  local_1208 = local_17b8;
  iStack_1204 = iStack_17b4;
  iStack_1200 = iStack_17b0;
  iStack_11fc = iStack_17ac;
  iVar112 = ((int)local_bf8 - (int)local_c08) + local_17b8;
  iVar116 = (local_bf8._4_4_ - local_c08._4_4_) + iStack_17b4;
  iVar113 = ((int)uStack_bf0 - (int)uStack_c00) + iStack_17b0;
  iVar117 = (uStack_bf0._4_4_ - uStack_c00._4_4_) + iStack_17ac;
  local_1808 = CONCAT44(iVar116,iVar112);
  uStack_1800._0_4_ = iVar113;
  uStack_1800._4_4_ = iVar117;
  local_1638 = local_1808;
  uStack_1630 = uStack_1800;
  local_163c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1808._4_4_ = iVar116 >> auVar110;
  local_1808._0_4_ = iVar112 >> auVar110;
  uStack_1800._0_4_ = iVar113 >> auVar110;
  uStack_1800._4_4_ = iVar117 >> auVar110;
  in0_15[1] = &local_18d8;
  in0_15[0] = (longlong)local_18f8;
  in1_15[1] = (longlong)&local_17f8;
  in1_15[0] = (longlong)&local_17e8;
  local_11c8 = uVar121;
  uStack_11c0 = uVar79;
  local_11b8 = uVar80;
  uStack_11b0 = uVar81;
  local_1168 = uVar82;
  uStack_1160 = uVar83;
  local_1158 = uVar84;
  uStack_1150 = uVar85;
  local_c08 = uVar86;
  uStack_c00 = uVar87;
  local_bf8 = uVar88;
  uStack_bf0 = uVar89;
  local_be8 = uVar90;
  uStack_be0 = uVar91;
  local_bd8 = uVar92;
  uStack_bd0 = uVar93;
  addsub_sse4_1(in0_15,in1_15,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_16[0] = &local_18e8;
  in0_16[1] = &local_18c8;
  in1_16[1] = (longlong)&local_17f8;
  in1_16[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_16,in1_16,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_17[0] = &local_18b8;
  in0_17[1] = &local_1898;
  in1_17[1] = (longlong)&local_17f8;
  in1_17[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_17,in1_17,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  in0_18[0] = &local_18a8;
  in0_18[1] = &local_1888;
  in1_18[1] = (longlong)&local_17f8;
  in1_18[0] = (longlong)&local_17e8;
  addsub_sse4_1(in0_18,in1_18,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                (__m128i *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
                (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690));
  uVar121 = local_18f8._0_8_;
  uVar79 = local_18f8._8_8_;
  local_1878 = local_18f8;
  local_8f8 = local_18d8;
  uStack_8f0 = uStack_18d0;
  local_908 = local_17a8;
  uStack_900 = uStack_17a0;
  auVar8._8_8_ = uStack_18d0;
  auVar8._0_8_ = local_18d8;
  auVar7._8_8_ = uStack_17a0;
  auVar7._0_8_ = local_17a8;
  auVar110 = pmulld(auVar8,auVar7);
  local_918 = local_18c8;
  uStack_910 = uStack_18c0;
  local_928 = local_17a8;
  uStack_920 = uStack_17a0;
  auVar6._8_8_ = uStack_18c0;
  auVar6._0_8_ = local_18c8;
  auVar5._8_8_ = uStack_17a0;
  auVar5._0_8_ = local_17a8;
  auVar111 = pmulld(auVar6,auVar5);
  local_18f8._0_8_ = auVar110._0_8_;
  local_18f8._8_8_ = auVar110._8_8_;
  local_1908._0_8_ = auVar111._0_8_;
  local_1908._8_8_ = auVar111._8_8_;
  local_1218 = local_18f8._0_8_;
  uVar86 = local_1218;
  uStack_1210 = local_18f8._8_8_;
  uVar87 = uStack_1210;
  local_1228 = local_1908._0_8_;
  uVar84 = local_1228;
  uStack_1220 = local_1908._8_8_;
  uVar85 = uStack_1220;
  local_1218._0_4_ = auVar110._0_4_;
  local_1218._4_4_ = auVar110._4_4_;
  uStack_1210._0_4_ = auVar110._8_4_;
  uStack_1210._4_4_ = auVar110._12_4_;
  local_1228._0_4_ = auVar111._0_4_;
  local_1228._4_4_ = auVar111._4_4_;
  uStack_1220._0_4_ = auVar111._8_4_;
  uStack_1220._4_4_ = auVar111._12_4_;
  local_1858 = CONCAT44(local_1218._4_4_ + local_1228._4_4_,(int)local_1218 + (int)local_1228);
  uStack_1850._0_4_ = (int)uStack_1210 + (int)uStack_1220;
  uStack_1850._4_4_ = uStack_1210._4_4_ + uStack_1220._4_4_;
  local_1238 = local_1858;
  uStack_1230 = uStack_1850;
  local_1248 = local_17b8;
  iStack_1244 = iStack_17b4;
  iStack_1240 = iStack_17b0;
  iStack_123c = iStack_17ac;
  local_1858._0_4_ = (int)local_1218 + (int)local_1228 + local_17b8;
  local_1858._4_4_ = local_1218._4_4_ + local_1228._4_4_ + iStack_17b4;
  iVar112 = (int)uStack_1210 + (int)uStack_1220 + iStack_17b0;
  iVar116 = uStack_1210._4_4_ + uStack_1220._4_4_ + iStack_17ac;
  uStack_1850._0_4_ = iVar112;
  uStack_1850._4_4_ = iVar116;
  local_1658 = local_1858;
  uStack_1650 = uStack_1850;
  local_165c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1858._0_4_ = (int)local_1858 >> auVar110;
  local_1858._4_4_ = local_1858._4_4_ >> auVar110;
  uStack_1850._0_4_ = iVar112 >> auVar110;
  uStack_1850._4_4_ = iVar116 >> auVar110;
  local_c18 = local_18f8._0_8_;
  uStack_c10 = local_18f8._8_8_;
  local_c28 = local_1908._0_8_;
  uStack_c20 = local_1908._8_8_;
  local_1848 = CONCAT44(local_1218._4_4_ - local_1228._4_4_,(int)local_1218 - (int)local_1228);
  uStack_1840._0_4_ = (int)uStack_1210 - (int)uStack_1220;
  uStack_1840._4_4_ = uStack_1210._4_4_ - uStack_1220._4_4_;
  local_1258 = local_1848;
  uStack_1250 = uStack_1840;
  local_1268 = local_17b8;
  iStack_1264 = iStack_17b4;
  iStack_1260 = iStack_17b0;
  iStack_125c = iStack_17ac;
  iVar112 = ((int)local_1218 - (int)local_1228) + local_17b8;
  iVar116 = (local_1218._4_4_ - local_1228._4_4_) + iStack_17b4;
  iVar113 = ((int)uStack_1210 - (int)uStack_1220) + iStack_17b0;
  iVar117 = (uStack_1210._4_4_ - uStack_1220._4_4_) + iStack_17ac;
  local_1848 = CONCAT44(iVar116,iVar112);
  uStack_1840._0_4_ = iVar113;
  uStack_1840._4_4_ = iVar117;
  local_1678 = local_1848;
  uStack_1670 = uStack_1840;
  local_167c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1848 = CONCAT44(iVar116 >> auVar110,iVar112 >> auVar110);
  uStack_1840._0_4_ = iVar113 >> auVar110;
  uStack_1840._4_4_ = iVar117 >> auVar110;
  local_938 = local_1898;
  uStack_930 = uStack_1890;
  local_948 = local_17a8;
  uStack_940 = uStack_17a0;
  auVar4._8_8_ = uStack_1890;
  auVar4._0_8_ = local_1898;
  auVar3._8_8_ = uStack_17a0;
  auVar3._0_8_ = local_17a8;
  local_18f8 = pmulld(auVar4,auVar3);
  local_958 = local_1888;
  uStack_950 = uStack_1880;
  local_968 = local_17a8;
  uStack_960 = uStack_17a0;
  auVar2._8_8_ = uStack_1880;
  auVar2._0_8_ = local_1888;
  auVar1._8_8_ = uStack_17a0;
  auVar1._0_8_ = local_17a8;
  local_1908 = pmulld(auVar2,auVar1);
  local_1278 = local_18f8._0_8_;
  uVar82 = local_1278;
  uStack_1270 = local_18f8._8_8_;
  uVar83 = uStack_1270;
  local_1288 = local_1908._0_8_;
  uVar80 = local_1288;
  uStack_1280 = local_1908._8_8_;
  uVar81 = uStack_1280;
  local_1278._0_4_ = local_18f8._0_4_;
  local_1278._4_4_ = local_18f8._4_4_;
  uStack_1270._0_4_ = local_18f8._8_4_;
  uStack_1270._4_4_ = local_18f8._12_4_;
  local_1288._0_4_ = local_1908._0_4_;
  local_1288._4_4_ = local_1908._4_4_;
  uStack_1280._0_4_ = local_1908._8_4_;
  uStack_1280._4_4_ = local_1908._12_4_;
  local_1818 = CONCAT44(local_1278._4_4_ + local_1288._4_4_,(int)local_1278 + (int)local_1288);
  uStack_1810._0_4_ = (int)uStack_1270 + (int)uStack_1280;
  uStack_1810._4_4_ = uStack_1270._4_4_ + uStack_1280._4_4_;
  local_1298 = local_1818;
  uStack_1290 = uStack_1810;
  local_12a8 = local_17b8;
  iStack_12a4 = iStack_17b4;
  iStack_12a0 = iStack_17b0;
  iStack_129c = iStack_17ac;
  iVar112 = (int)local_1278 + (int)local_1288 + local_17b8;
  iVar116 = local_1278._4_4_ + local_1288._4_4_ + iStack_17b4;
  iVar113 = (int)uStack_1270 + (int)uStack_1280 + iStack_17b0;
  iVar117 = uStack_1270._4_4_ + uStack_1280._4_4_ + iStack_17ac;
  local_1818 = CONCAT44(iVar116,iVar112);
  uStack_1810._0_4_ = iVar113;
  uStack_1810._4_4_ = iVar117;
  local_1698 = local_1818;
  uStack_1690 = uStack_1810;
  local_169c = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1818 = CONCAT44(iVar116 >> auVar110,iVar112 >> auVar110);
  uStack_1810._0_4_ = iVar113 >> auVar110;
  uStack_1810._4_4_ = iVar117 >> auVar110;
  local_c38 = local_18f8._0_8_;
  uStack_c30 = local_18f8._8_8_;
  local_c48 = local_1908._0_8_;
  uStack_c40 = local_1908._8_8_;
  local_1808 = CONCAT44(local_1278._4_4_ - local_1288._4_4_,(int)local_1278 - (int)local_1288);
  uStack_1800._0_4_ = (int)uStack_1270 - (int)uStack_1280;
  uStack_1800._4_4_ = uStack_1270._4_4_ - uStack_1280._4_4_;
  local_12b8 = local_1808;
  uStack_12b0 = uStack_1800;
  local_12c8 = local_17b8;
  iStack_12c4 = iStack_17b4;
  iStack_12c0 = iStack_17b0;
  iStack_12bc = iStack_17ac;
  local_1808._0_4_ = ((int)local_1278 - (int)local_1288) + local_17b8;
  local_1808._4_4_ = (local_1278._4_4_ - local_1288._4_4_) + iStack_17b4;
  iVar112 = ((int)uStack_1270 - (int)uStack_1280) + iStack_17b0;
  iVar116 = (uStack_1270._4_4_ - uStack_1280._4_4_) + iStack_17ac;
  uStack_1800._0_4_ = iVar112;
  uStack_1800._4_4_ = iVar116;
  local_16b8 = local_1808;
  uStack_16b0 = uStack_1800;
  local_16bc = local_16d4;
  auVar110 = ZEXT416(local_16d4);
  local_1808._0_4_ = (int)local_1808 >> auVar110;
  local_1808._4_4_ = local_1808._4_4_ >> auVar110;
  uStack_1800._0_4_ = iVar112 >> auVar110;
  uStack_1800._4_4_ = iVar116 >> auVar110;
  if (local_16d8 == 0) {
    if (local_16dc + 6 < 0x10) {
      iVar112 = 0x10;
    }
    else {
      iVar112 = local_16dc + 6;
    }
    local_193c._0_1_ = (char)iVar112;
    local_9b0 = -(1 << ((char)local_193c - 1U & 0x1f));
    local_1958 = CONCAT44(local_9b0,local_9b0);
    uStack_1950 = CONCAT44(local_9b0,local_9b0);
    local_9b4 = (1 << ((char)local_193c - 1U & 0x1f)) + -1;
    uVar121 = CONCAT44(local_9b4,local_9b4);
    uStack_20 = CONCAT44(local_9b4,local_9b4);
    in0_19[0] = local_16d0 + 2;
    in0_19[1] = local_16d0 + 6;
    in1_19[1] = (longlong)&stack0xffffffffffffe698;
    in1_19[0] = (longlong)&local_1958;
    local_193c = iVar112;
    local_1288 = uVar80;
    uStack_1280 = uVar81;
    local_1278 = uVar82;
    uStack_1270 = uVar83;
    local_1228 = uVar84;
    uStack_1220 = uVar85;
    local_1218 = uVar86;
    uStack_1210 = uVar87;
    local_48 = local_1958;
    uStack_40 = uStack_1950;
    local_38 = local_9b0;
    local_34 = local_9b0;
    local_30 = local_9b0;
    local_2c = local_9b0;
    local_28 = uVar121;
    local_10 = local_9b4;
    local_c = local_9b4;
    local_8 = local_9b4;
    local_4 = local_9b4;
    neg_shift_sse4_1(in0_19,in1_19,(__m128i *)(ulong)local_16e0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                     (__m128i *)CONCAT44(iVar112,in_stack_ffffffffffffe688),
                     (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690),local_9b4);
    in0_20[0] = local_16d0 + 10;
    in0_20[1] = local_16d0 + 0xe;
    iVar116 = (int)uVar121;
    in1_20[1] = (longlong)&stack0xffffffffffffe698;
    in1_20[0] = (longlong)&local_1958;
    neg_shift_sse4_1(in0_20,in1_20,(__m128i *)(ulong)local_16e0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                     (__m128i *)CONCAT44(iVar112,in_stack_ffffffffffffe688),
                     (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690),iVar116);
    in0_21[0] = local_16d0 + 0x12;
    in0_21[1] = local_16d0 + 0x16;
    in1_21[1] = (longlong)&stack0xffffffffffffe698;
    in1_21[0] = (longlong)&local_1958;
    neg_shift_sse4_1(in0_21,in1_21,(__m128i *)(ulong)local_16e0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                     (__m128i *)CONCAT44(iVar112,in_stack_ffffffffffffe688),
                     (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690),iVar116);
    in0_22[0] = local_16d0 + 0x1a;
    in0_22[1] = local_16d0 + 0x1e;
    in1_22[1] = (longlong)&stack0xffffffffffffe698;
    in1_22[0] = (longlong)&local_1958;
    neg_shift_sse4_1(in0_22,in1_22,(__m128i *)(ulong)local_16e0,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                     (__m128i *)CONCAT44(iVar112,in_stack_ffffffffffffe688),
                     (__m128i *)CONCAT44(iVar120,in_stack_ffffffffffffe690),iVar116);
  }
  else {
    local_16d0[2] = uVar121;
    local_16d0[3] = uVar79;
    local_c58 = (int)local_17c8;
    iStack_c54 = (int)((ulong)local_17c8 >> 0x20);
    iStack_c50 = (int)uStack_17c0;
    iStack_c4c = (int)((ulong)uStack_17c0 >> 0x20);
    local_c68 = (int)local_18b8;
    iStack_c64 = (int)((ulong)local_18b8 >> 0x20);
    iStack_c60 = (int)uStack_18b0;
    iStack_c5c = (int)((ulong)uStack_18b0 >> 0x20);
    *(int *)(local_16d0 + 6) = local_c58 - local_c68;
    *(int *)((long)local_16d0 + 0x34) = iStack_c54 - iStack_c64;
    *(int *)(local_16d0 + 7) = iStack_c50 - iStack_c60;
    *(int *)((long)local_16d0 + 0x3c) = iStack_c4c - iStack_c5c;
    local_16d0[10] = local_1818;
    local_16d0[0xb] = uStack_1810;
    *(int *)(local_16d0 + 0xe) = local_c58 - (int)local_1858;
    *(int *)((long)local_16d0 + 0x74) = iStack_c54 - local_1858._4_4_;
    *(int *)(local_16d0 + 0xf) = iStack_c50 - (int)uStack_1850;
    *(int *)((long)local_16d0 + 0x7c) = iStack_c4c - uStack_1850._4_4_;
    local_16d0[0x12] = local_1848;
    local_16d0[0x13] = uStack_1840;
    *(int *)(local_16d0 + 0x16) = local_c58 - (int)local_1808;
    *(int *)((long)local_16d0 + 0xb4) = iStack_c54 - local_1808._4_4_;
    *(int *)(local_16d0 + 0x17) = iStack_c50 - (int)uStack_1800;
    *(int *)((long)local_16d0 + 0xbc) = iStack_c4c - uStack_1800._4_4_;
    local_16d0[0x1a] = local_18a8;
    local_16d0[0x1b] = uStack_18a0;
    local_cc8 = (int)local_18e8;
    iStack_cc4 = (int)((ulong)local_18e8 >> 0x20);
    iStack_cc0 = (int)uStack_18e0;
    iStack_cbc = (int)((ulong)uStack_18e0 >> 0x20);
    *(int *)(local_16d0 + 0x1e) = local_c58 - local_cc8;
    *(int *)((long)local_16d0 + 0xf4) = iStack_c54 - iStack_cc4;
    *(int *)(local_16d0 + 0x1f) = iStack_c50 - iStack_cc0;
    *(int *)((long)local_16d0 + 0xfc) = iStack_c4c - iStack_cbc;
  }
  return;
}

Assistant:

static void iadst8x8_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                            int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[8], v[8], x;

  // Even 8 points: 0, 2, ..., 14
  // stage 0
  // stage 1
  // stage 2
  // (1)
  u[0] = _mm_mullo_epi32(in[14], cospi4);
  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[14], cospi60);
  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[10], cospi20);
  x = _mm_mullo_epi32(in[4], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[10], cospi44);
  x = _mm_mullo_epi32(in[4], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[6], cospi36);
  x = _mm_mullo_epi32(in[8], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[6], cospi28);
  x = _mm_mullo_epi32(in[8], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[2], cospi52);
  x = _mm_mullo_epi32(in[12], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[2], cospi12);
  x = _mm_mullo_epi32(in[12], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[2] = _mm_sub_epi32(kZero, u[4]);
    out[4] = u[6];
    out[6] = _mm_sub_epi32(kZero, u[2]);
    out[8] = u[3];
    out[10] = _mm_sub_epi32(kZero, u[7]);
    out[12] = u[5];
    out[14] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 2, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 4, out + 6, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 8, out + 10, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 12, out + 14, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }

  // Odd 8 points: 1, 3, ..., 15
  // stage 0
  // stage 1
  // stage 2
  // (1)
  u[0] = _mm_mullo_epi32(in[15], cospi4);
  x = _mm_mullo_epi32(in[1], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[15], cospi60);
  x = _mm_mullo_epi32(in[1], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[11], cospi20);
  x = _mm_mullo_epi32(in[5], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[11], cospi44);
  x = _mm_mullo_epi32(in[5], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[7], cospi36);
  x = _mm_mullo_epi32(in[9], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[7], cospi28);
  x = _mm_mullo_epi32(in[9], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[3], cospi52);
  x = _mm_mullo_epi32(in[13], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[3], cospi12);
  x = _mm_mullo_epi32(in[13], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[1] = u[0];
    out[3] = _mm_sub_epi32(kZero, u[4]);
    out[5] = u[6];
    out[7] = _mm_sub_epi32(kZero, u[2]);
    out[9] = u[3];
    out[11] = _mm_sub_epi32(kZero, u[7]);
    out[13] = u[5];
    out[15] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 1, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 5, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 9, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 13, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}